

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  byte bVar74;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar75;
  byte bVar76;
  byte bVar77;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ulong uVar78;
  undefined8 in_R11;
  byte bVar79;
  ulong uVar80;
  bool bVar81;
  ulong uVar82;
  uint uVar83;
  undefined1 auVar92 [16];
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float pp;
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar155;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar142 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar171;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  float fVar210;
  float fVar211;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar223 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [16];
  float fVar240;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar241 [28];
  float fVar242;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  float s;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_974;
  int local_964;
  undefined1 local_960 [32];
  ulong local_930;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  uint local_7c8;
  uint local_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined4 local_698;
  float local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  uint local_684;
  uint local_680;
  Primitive *local_670;
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  ulong local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar121 [32];
  
  uVar80 = (ulong)(byte)prim[1];
  fVar192 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  fVar170 = fVar192 * auVar90._0_4_;
  fVar139 = fVar192 * (ray->dir).field_0.m128[0];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar87);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar91);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar80 * 0xc + 6);
  auVar100 = vpmovsxbd_avx2(auVar85);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 * 0xd + 6);
  auVar101 = vpmovsxbd_avx2(auVar88);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar80 * 0x12 + 6);
  auVar102 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar80 * 0x13 + 6);
  auVar106 = vpmovsxbd_avx2(auVar234);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar80 * 0x14 + 6);
  auVar95 = vpmovsxbd_avx2(auVar3);
  auVar103 = vcvtdq2ps_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar95);
  auVar114._4_4_ = fVar139;
  auVar114._0_4_ = fVar139;
  auVar114._8_4_ = fVar139;
  auVar114._12_4_ = fVar139;
  auVar114._16_4_ = fVar139;
  auVar114._20_4_ = fVar139;
  auVar114._24_4_ = fVar139;
  auVar114._28_4_ = fVar139;
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar192 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar192 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar192 * (ray->dir).field_0.m128[1],fVar139))));
  auVar107 = vpermps_avx2(auVar118,auVar108);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar94 = vpermps_avx512vl(auVar93,auVar108);
  fVar139 = auVar94._0_4_;
  fVar210 = auVar94._4_4_;
  auVar108._4_4_ = fVar210 * auVar97._4_4_;
  auVar108._0_4_ = fVar139 * auVar97._0_4_;
  fVar211 = auVar94._8_4_;
  auVar108._8_4_ = fVar211 * auVar97._8_4_;
  fVar212 = auVar94._12_4_;
  auVar108._12_4_ = fVar212 * auVar97._12_4_;
  fVar213 = auVar94._16_4_;
  auVar108._16_4_ = fVar213 * auVar97._16_4_;
  fVar214 = auVar94._20_4_;
  auVar108._20_4_ = fVar214 * auVar97._20_4_;
  fVar155 = auVar94._24_4_;
  auVar108._24_4_ = fVar155 * auVar97._24_4_;
  auVar108._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar101._4_4_ * fVar210;
  auVar95._0_4_ = auVar101._0_4_ * fVar139;
  auVar95._8_4_ = auVar101._8_4_ * fVar211;
  auVar95._12_4_ = auVar101._12_4_ * fVar212;
  auVar95._16_4_ = auVar101._16_4_ * fVar213;
  auVar95._20_4_ = auVar101._20_4_ * fVar214;
  auVar95._24_4_ = auVar101._24_4_ * fVar155;
  auVar95._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar105._4_4_ * fVar210;
  auVar106._0_4_ = auVar105._0_4_ * fVar139;
  auVar106._8_4_ = auVar105._8_4_ * fVar211;
  auVar106._12_4_ = auVar105._12_4_ * fVar212;
  auVar106._16_4_ = auVar105._16_4_ * fVar213;
  auVar106._20_4_ = auVar105._20_4_ * fVar214;
  auVar106._24_4_ = auVar105._24_4_ * fVar155;
  auVar106._28_4_ = auVar94._28_4_;
  auVar86 = vfmadd231ps_fma(auVar108,auVar107,auVar96);
  auVar87 = vfmadd231ps_fma(auVar95,auVar107,auVar100);
  auVar84 = vfmadd231ps_fma(auVar106,auVar103,auVar107);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar114,auVar99);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar114,auVar98);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,auVar114);
  auVar117._4_4_ = fVar170;
  auVar117._0_4_ = fVar170;
  auVar117._8_4_ = fVar170;
  auVar117._12_4_ = fVar170;
  auVar117._16_4_ = fVar170;
  auVar117._20_4_ = fVar170;
  auVar117._24_4_ = fVar170;
  auVar117._28_4_ = fVar170;
  auVar95 = ZEXT1632(CONCAT412(fVar192 * auVar90._12_4_,
                               CONCAT48(fVar192 * auVar90._8_4_,
                                        CONCAT44(fVar192 * auVar90._4_4_,fVar170))));
  auVar106 = vpermps_avx2(auVar118,auVar95);
  auVar95 = vpermps_avx512vl(auVar93,auVar95);
  fVar192 = auVar95._0_4_;
  fVar139 = auVar95._4_4_;
  auVar107._4_4_ = fVar139 * auVar97._4_4_;
  auVar107._0_4_ = fVar192 * auVar97._0_4_;
  fVar210 = auVar95._8_4_;
  auVar107._8_4_ = fVar210 * auVar97._8_4_;
  fVar211 = auVar95._12_4_;
  auVar107._12_4_ = fVar211 * auVar97._12_4_;
  fVar212 = auVar95._16_4_;
  auVar107._16_4_ = fVar212 * auVar97._16_4_;
  fVar213 = auVar95._20_4_;
  auVar107._20_4_ = fVar213 * auVar97._20_4_;
  fVar214 = auVar95._24_4_;
  auVar107._24_4_ = fVar214 * auVar97._24_4_;
  auVar107._28_4_ = 1;
  auVar93._4_4_ = auVar101._4_4_ * fVar139;
  auVar93._0_4_ = auVar101._0_4_ * fVar192;
  auVar93._8_4_ = auVar101._8_4_ * fVar210;
  auVar93._12_4_ = auVar101._12_4_ * fVar211;
  auVar93._16_4_ = auVar101._16_4_ * fVar212;
  auVar93._20_4_ = auVar101._20_4_ * fVar213;
  auVar93._24_4_ = auVar101._24_4_ * fVar214;
  auVar93._28_4_ = auVar97._28_4_;
  auVar101._4_4_ = auVar105._4_4_ * fVar139;
  auVar101._0_4_ = auVar105._0_4_ * fVar192;
  auVar101._8_4_ = auVar105._8_4_ * fVar210;
  auVar101._12_4_ = auVar105._12_4_ * fVar211;
  auVar101._16_4_ = auVar105._16_4_ * fVar212;
  auVar101._20_4_ = auVar105._20_4_ * fVar213;
  auVar101._24_4_ = auVar105._24_4_ * fVar214;
  auVar101._28_4_ = auVar95._28_4_;
  auVar91 = vfmadd231ps_fma(auVar107,auVar106,auVar96);
  auVar85 = vfmadd231ps_fma(auVar93,auVar106,auVar100);
  auVar88 = vfmadd231ps_fma(auVar101,auVar106,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar117,auVar99);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar117,auVar98);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar117,auVar102);
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  auVar99 = vandps_avx(ZEXT1632(auVar86),auVar113);
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar99,auVar104,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar94._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar86._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar87),auVar113);
  uVar82 = vcmpps_avx512vl(auVar99,auVar104,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar109._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar87._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar84),auVar113);
  uVar82 = vcmpps_avx512vl(auVar99,auVar104,1);
  bVar81 = (bool)((byte)uVar82 & 1);
  auVar99._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._0_4_;
  bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._4_4_;
  bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._8_4_;
  bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar255 = ZEXT3264(auVar97);
  auVar98 = vfnmadd213ps_avx512vl(auVar94,auVar96,auVar97);
  auVar86 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar109);
  auVar98 = vfnmadd213ps_avx512vl(auVar109,auVar96,auVar97);
  auVar87 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar99);
  auVar99 = vfnmadd213ps_avx512vl(auVar99,auVar96,auVar97);
  auVar84 = vfmadd132ps_fma(auVar99,auVar96,auVar96);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar91));
  auVar102._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar102._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar102._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar102._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar102._16_4_ = auVar99._16_4_ * 0.0;
  auVar102._20_4_ = auVar99._20_4_ * 0.0;
  auVar102._24_4_ = auVar99._24_4_ * 0.0;
  auVar102._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar91));
  auVar112._0_4_ = auVar86._0_4_ * auVar99._0_4_;
  auVar112._4_4_ = auVar86._4_4_ * auVar99._4_4_;
  auVar112._8_4_ = auVar86._8_4_ * auVar99._8_4_;
  auVar112._12_4_ = auVar86._12_4_ * auVar99._12_4_;
  auVar112._16_4_ = auVar99._16_4_ * 0.0;
  auVar112._20_4_ = auVar99._20_4_ * 0.0;
  auVar112._24_4_ = auVar99._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar85));
  auVar103._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar103._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar103._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar103._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar85));
  auVar111._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar111._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar111._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar111._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar111._16_4_ = auVar99._16_4_ * 0.0;
  auVar111._20_4_ = auVar99._20_4_ * 0.0;
  auVar111._24_4_ = auVar99._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x15 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar88));
  auVar105._4_4_ = auVar99._4_4_ * auVar84._4_4_;
  auVar105._0_4_ = auVar99._0_4_ * auVar84._0_4_;
  auVar105._8_4_ = auVar99._8_4_ * auVar84._8_4_;
  auVar105._12_4_ = auVar99._12_4_ * auVar84._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar88));
  auVar110._0_4_ = auVar84._0_4_ * auVar99._0_4_;
  auVar110._4_4_ = auVar84._4_4_ * auVar99._4_4_;
  auVar110._8_4_ = auVar84._8_4_ * auVar99._8_4_;
  auVar110._12_4_ = auVar84._12_4_ * auVar99._12_4_;
  auVar110._16_4_ = auVar99._16_4_ * 0.0;
  auVar110._20_4_ = auVar99._20_4_ * 0.0;
  auVar110._24_4_ = auVar99._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar102,auVar112);
  auVar96 = vpminsd_avx2(auVar103,auVar111);
  auVar99 = vmaxps_avx(auVar99,auVar96);
  auVar96 = vpminsd_avx2(auVar105,auVar110);
  uVar140 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar97._4_4_ = uVar140;
  auVar97._0_4_ = uVar140;
  auVar97._8_4_ = uVar140;
  auVar97._12_4_ = uVar140;
  auVar97._16_4_ = uVar140;
  auVar97._20_4_ = uVar140;
  auVar97._24_4_ = uVar140;
  auVar97._28_4_ = uVar140;
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar99 = vmaxps_avx(auVar99,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar99,auVar96);
  auVar99 = vpmaxsd_avx2(auVar102,auVar112);
  auVar96 = vpmaxsd_avx2(auVar103,auVar111);
  auVar99 = vminps_avx(auVar99,auVar96);
  auVar96 = vpmaxsd_avx2(auVar105,auVar110);
  fVar192 = ray->tfar;
  auVar98._4_4_ = fVar192;
  auVar98._0_4_ = fVar192;
  auVar98._8_4_ = fVar192;
  auVar98._12_4_ = fVar192;
  auVar98._16_4_ = fVar192;
  auVar98._20_4_ = fVar192;
  auVar98._24_4_ = fVar192;
  auVar98._28_4_ = fVar192;
  auVar96 = vminps_avx512vl(auVar96,auVar98);
  auVar99 = vminps_avx(auVar99,auVar96);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar100);
  auVar96 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_2e0,auVar99,2);
  uVar15 = vpcmpgtd_avx512vl(auVar96,_DAT_01fb4ba0);
  local_668 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar13 & (byte)uVar15));
  local_670 = prim;
LAB_01a3a1ed:
  if (local_668 == 0) {
LAB_01a3cac4:
    return local_668 != 0;
  }
  lVar17 = 0;
  for (uVar82 = local_668; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar17 = lVar17 + 1;
  }
  local_928 = (ulong)*(uint *)(prim + 2);
  local_930 = (ulong)*(uint *)(prim + lVar17 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_928].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_930);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar17 = *(long *)&pGVar4[1].time_range.upper;
  auVar86 = *(undefined1 (*) [16])(lVar17 + (long)p_Var5 * uVar82);
  auVar87 = *(undefined1 (*) [16])(lVar17 + (uVar82 + 1) * (long)p_Var5);
  local_4e8 = local_668 - 1 & local_668;
  if (local_4e8 != 0) {
    uVar78 = local_4e8 - 1 & local_4e8;
    for (uVar80 = local_4e8; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    }
    if (uVar78 != 0) {
      for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar92._0_4_ = auVar86._0_4_ + auVar87._0_4_;
  auVar92._4_4_ = auVar86._4_4_ + auVar87._4_4_;
  auVar92._8_4_ = auVar86._8_4_ + auVar87._8_4_;
  auVar92._12_4_ = auVar86._12_4_ + auVar87._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar90._8_4_ = 0x3f000000;
  auVar90._0_8_ = 0x3f0000003f000000;
  auVar90._12_4_ = 0x3f000000;
  auVar84 = vmulps_avx512vl(auVar92,auVar90);
  auVar84 = vsubps_avx(auVar84,(undefined1  [16])aVar1);
  auVar84 = vdpps_avx(auVar84,(undefined1  [16])aVar2,0x7f);
  auVar91 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar88 = ZEXT816(0) << 0x40;
  auVar244 = ZEXT1664(auVar88);
  auVar233._4_12_ = ZEXT812(0) << 0x20;
  auVar233._0_4_ = auVar91._0_4_;
  auVar85 = vrcp14ss_avx512f(auVar88,auVar233);
  auVar237 = ZEXT1664(auVar85);
  auVar91 = vfnmadd213ss_fma(auVar85,auVar91,ZEXT416(0x40000000));
  fVar192 = auVar84._0_4_ * auVar85._0_4_ * auVar91._0_4_;
  local_550 = ZEXT416((uint)fVar192);
  auVar219._4_4_ = fVar192;
  auVar219._0_4_ = fVar192;
  auVar219._8_4_ = fVar192;
  auVar219._12_4_ = fVar192;
  fStack_410 = fVar192;
  _local_420 = auVar219;
  fStack_40c = fVar192;
  fStack_408 = fVar192;
  fStack_404 = fVar192;
  auVar84 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar219);
  auVar84 = vblendps_avx(auVar84,auVar88,8);
  auVar86 = vsubps_avx(auVar86,auVar84);
  local_760 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar253 = ZEXT3264(local_760);
  auVar91 = vsubps_avx(*(undefined1 (*) [16])(lVar17 + (uVar82 + 2) * (long)p_Var5),auVar84);
  local_780 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar257 = ZEXT3264(local_780);
  local_460 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar231 = ZEXT1664(auVar87);
  auVar84 = vsubps_avx(*(undefined1 (*) [16])(lVar17 + (uVar82 + 3) * (long)p_Var5),auVar84);
  local_820 = vbroadcastss_avx512vl(auVar86);
  auVar248 = ZEXT3264(local_820);
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_5c0 = ZEXT1632(auVar86);
  local_840 = vpermps_avx512vl(auVar120,local_5c0);
  auVar249 = ZEXT3264(local_840);
  auVar121._8_4_ = 2;
  auVar121._0_8_ = 0x200000002;
  auVar121._12_4_ = 2;
  auVar121._16_4_ = 2;
  auVar121._20_4_ = 2;
  auVar121._24_4_ = 2;
  auVar121._28_4_ = 2;
  local_860 = vpermps_avx512vl(auVar121,local_5c0);
  auVar250 = ZEXT3264(local_860);
  auVar184._8_4_ = 3;
  auVar184._0_8_ = 0x300000003;
  auVar184._12_4_ = 3;
  auVar184._16_4_ = 3;
  auVar184._20_4_ = 3;
  auVar184._24_4_ = 3;
  auVar184._28_4_ = 3;
  local_880 = vpermps_avx512vl(auVar184,local_5c0);
  auVar251 = ZEXT3264(local_880);
  local_8a0 = vbroadcastss_avx512vl(auVar87);
  auVar252 = ZEXT3264(local_8a0);
  local_600 = ZEXT1632(auVar87);
  local_8c0 = vpermps_avx512vl(auVar120,local_600);
  auVar254 = ZEXT3264(local_8c0);
  local_8e0 = vpermps_avx512vl(auVar121,local_600);
  auVar256 = ZEXT3264(local_8e0);
  local_900 = vpermps_avx512vl(auVar184,local_600);
  auVar258 = ZEXT3264(local_900);
  local_7a0 = vbroadcastss_avx512vl(auVar91);
  auVar259 = ZEXT3264(local_7a0);
  local_5e0 = ZEXT1632(auVar91);
  local_7c0 = vpermps_avx512vl(auVar120,local_5e0);
  auVar260 = ZEXT3264(local_7c0);
  local_1e0 = vpermps_avx2(auVar121,local_5e0);
  local_200 = vpermps_avx2(auVar184,local_5e0);
  uVar140 = auVar84._0_4_;
  local_2c0._4_4_ = uVar140;
  local_2c0._0_4_ = uVar140;
  local_2c0._8_4_ = uVar140;
  local_2c0._12_4_ = uVar140;
  local_2c0._16_4_ = uVar140;
  local_2c0._20_4_ = uVar140;
  local_2c0._24_4_ = uVar140;
  local_2c0._28_4_ = uVar140;
  _local_620 = ZEXT1632(auVar84);
  _local_220 = vpermps_avx2(auVar120,_local_620);
  _local_240 = vpermps_avx2(auVar121,_local_620);
  local_260 = vpermps_avx2(auVar184,_local_620);
  auVar99 = vpermps_avx2(auVar121,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar99 = vfmadd231ps_avx512vl(auVar99,local_780,local_780);
  local_280 = vfmadd231ps_avx512vl(auVar99,local_760,local_760);
  auVar119._8_4_ = 0x7fffffff;
  auVar119._0_8_ = 0x7fffffff7fffffff;
  auVar119._12_4_ = 0x7fffffff;
  auVar119._16_4_ = 0x7fffffff;
  auVar119._20_4_ = 0x7fffffff;
  auVar119._24_4_ = 0x7fffffff;
  auVar119._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_280,auVar119);
  local_2a0 = local_280;
  uVar75 = 0;
  bVar79 = 0;
  local_974 = 1;
  local_3b0 = ZEXT816(0x3f80000000000000);
  uStack_45c = local_460;
  uStack_458 = local_460;
  uStack_454 = local_460;
  uStack_450 = local_460;
  uStack_44c = local_460;
  uStack_448 = local_460;
  uStack_444 = local_460;
  do {
    auVar86 = vmovshdup_avx(local_3b0);
    auVar86 = vsubps_avx(auVar86,local_3b0);
    auVar141._0_4_ = auVar86._0_4_;
    fVar155 = auVar141._0_4_ * 0.04761905;
    uVar140 = local_3b0._0_4_;
    local_740._4_4_ = uVar140;
    local_740._0_4_ = uVar140;
    local_740._8_4_ = uVar140;
    local_740._12_4_ = uVar140;
    local_740._16_4_ = uVar140;
    local_740._20_4_ = uVar140;
    local_740._24_4_ = uVar140;
    local_740._28_4_ = uVar140;
    auVar141._4_4_ = auVar141._0_4_;
    auVar141._8_4_ = auVar141._0_4_;
    auVar141._12_4_ = auVar141._0_4_;
    local_580._16_4_ = auVar141._0_4_;
    local_580._0_16_ = auVar141;
    local_580._20_4_ = auVar141._0_4_;
    local_580._24_4_ = auVar141._0_4_;
    local_580._28_4_ = auVar141._0_4_;
    auVar86 = vfmadd231ps_fma(local_740,local_580,_DAT_01f7b040);
    auVar99 = vsubps_avx512vl(auVar255._0_32_,ZEXT1632(auVar86));
    fVar192 = auVar86._0_4_;
    fVar139 = auVar86._4_4_;
    fVar210 = auVar86._8_4_;
    fVar211 = auVar86._12_4_;
    fVar212 = auVar99._0_4_;
    fVar213 = auVar99._4_4_;
    fVar214 = auVar99._8_4_;
    fVar224 = auVar99._12_4_;
    fVar171 = auVar99._16_4_;
    fVar225 = auVar99._20_4_;
    fVar226 = auVar99._24_4_;
    auVar40._4_4_ = fVar213 * fVar213 * -fVar139;
    auVar40._0_4_ = fVar212 * fVar212 * -fVar192;
    auVar40._8_4_ = fVar214 * fVar214 * -fVar210;
    auVar40._12_4_ = fVar224 * fVar224 * -fVar211;
    auVar40._16_4_ = fVar171 * fVar171 * -0.0;
    auVar40._20_4_ = fVar225 * fVar225 * -0.0;
    auVar40._24_4_ = fVar226 * fVar226 * -0.0;
    auVar40._28_4_ = 0x80000000;
    fVar232 = fVar192 * 3.0;
    fVar238 = fVar139 * 3.0;
    fVar239 = fVar210 * 3.0;
    fVar240 = fVar211 * 3.0;
    auVar255._28_36_ = auVar237._28_36_;
    auVar255._0_28_ = ZEXT1628(CONCAT412(fVar240,CONCAT48(fVar239,CONCAT44(fVar238,fVar232))));
    fVar242 = auVar237._28_4_ + -5.0;
    auVar166._0_4_ = (fVar232 + -5.0) * fVar192 * fVar192 + 2.0;
    auVar166._4_4_ = (fVar238 + -5.0) * fVar139 * fVar139 + 2.0;
    auVar166._8_4_ = (fVar239 + -5.0) * fVar210 * fVar210 + 2.0;
    auVar166._12_4_ = (fVar240 + -5.0) * fVar211 * fVar211 + 2.0;
    auVar166._16_4_ = 0x40000000;
    auVar166._20_4_ = 0x40000000;
    auVar166._24_4_ = 0x40000000;
    auVar166._28_4_ = DAT_01f7b040._28_4_ + 2.0;
    auVar237._0_4_ = fVar212 * fVar212;
    auVar237._4_4_ = fVar213 * fVar213;
    auVar237._8_4_ = fVar214 * fVar214;
    auVar237._12_4_ = fVar224 * fVar224;
    auVar237._16_4_ = fVar171 * fVar171;
    auVar237._20_4_ = fVar225 * fVar225;
    auVar237._28_36_ = auVar244._28_36_;
    auVar237._24_4_ = fVar226 * fVar226;
    auVar185._0_4_ = auVar237._0_4_ * (fVar212 * 3.0 + -5.0) + 2.0;
    auVar185._4_4_ = auVar237._4_4_ * (fVar213 * 3.0 + -5.0) + 2.0;
    auVar185._8_4_ = auVar237._8_4_ * (fVar214 * 3.0 + -5.0) + 2.0;
    auVar185._12_4_ = auVar237._12_4_ * (fVar224 * 3.0 + -5.0) + 2.0;
    auVar185._16_4_ = auVar237._16_4_ * (fVar171 * 3.0 + -5.0) + 2.0;
    auVar185._20_4_ = auVar237._20_4_ * (fVar225 * 3.0 + -5.0) + 2.0;
    auVar185._24_4_ = auVar237._24_4_ * (fVar226 * 3.0 + -5.0) + 2.0;
    auVar185._28_4_ = auVar231._28_4_ + -5.0 + 2.0;
    fVar170 = auVar99._28_4_;
    auVar41._4_4_ = fVar139 * fVar139 * -fVar213;
    auVar41._0_4_ = fVar192 * fVar192 * -fVar212;
    auVar41._8_4_ = fVar210 * fVar210 * -fVar214;
    auVar41._12_4_ = fVar211 * fVar211 * -fVar224;
    auVar41._16_4_ = -fVar171 * 0.0 * 0.0;
    auVar41._20_4_ = -fVar225 * 0.0 * 0.0;
    auVar41._24_4_ = -fVar226 * 0.0 * 0.0;
    auVar41._28_4_ = -fVar170;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar99 = vmulps_avx512vl(auVar40,auVar98);
    auVar100 = vmulps_avx512vl(auVar166,auVar98);
    auVar96 = vmulps_avx512vl(auVar185,auVar98);
    auVar97 = vmulps_avx512vl(auVar41,auVar98);
    auVar101 = vmulps_avx512vl(local_2c0,auVar97);
    auVar42._4_4_ = (float)local_220._4_4_ * auVar97._4_4_;
    auVar42._0_4_ = (float)local_220._0_4_ * auVar97._0_4_;
    auVar42._8_4_ = fStack_218 * auVar97._8_4_;
    auVar42._12_4_ = fStack_214 * auVar97._12_4_;
    auVar42._16_4_ = fStack_210 * auVar97._16_4_;
    auVar42._20_4_ = fStack_20c * auVar97._20_4_;
    auVar42._24_4_ = fStack_208 * auVar97._24_4_;
    auVar42._28_4_ = auVar185._28_4_;
    auVar43._4_4_ = (float)local_240._4_4_ * auVar97._4_4_;
    auVar43._0_4_ = (float)local_240._0_4_ * auVar97._0_4_;
    auVar43._8_4_ = fStack_238 * auVar97._8_4_;
    auVar43._12_4_ = fStack_234 * auVar97._12_4_;
    auVar43._16_4_ = fStack_230 * auVar97._16_4_;
    auVar43._20_4_ = fStack_22c * auVar97._20_4_;
    auVar43._24_4_ = fStack_228 * auVar97._24_4_;
    auVar43._28_4_ = auVar166._28_4_;
    auVar97 = vmulps_avx512vl(local_260,auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar259._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar42,auVar96,auVar260._0_32_);
    auVar86 = vfmadd231ps_fma(auVar43,auVar96,local_1e0);
    auVar96 = vfmadd231ps_avx512vl(auVar97,local_200,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar252._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar254._0_32_);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar100,auVar256._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar258._0_32_,auVar100);
    local_6c0 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar248._0_32_);
    local_5a0 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar249._0_32_);
    local_480 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar250._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar96,auVar251._0_32_,auVar99);
    auVar44._4_4_ = (fVar213 + fVar213) * fVar139;
    auVar44._0_4_ = (fVar212 + fVar212) * fVar192;
    auVar44._8_4_ = (fVar214 + fVar214) * fVar210;
    auVar44._12_4_ = (fVar224 + fVar224) * fVar211;
    auVar44._16_4_ = (fVar171 + fVar171) * 0.0;
    auVar44._20_4_ = (fVar225 + fVar225) * 0.0;
    auVar44._24_4_ = (fVar226 + fVar226) * 0.0;
    auVar44._28_4_ = auVar100._28_4_;
    auVar99 = vsubps_avx(auVar44,auVar237._0_32_);
    auVar217._0_28_ =
         ZEXT1628(CONCAT412((fVar211 + fVar211) * (fVar240 + -5.0) + fVar240 * fVar211,
                            CONCAT48((fVar210 + fVar210) * (fVar239 + -5.0) + fVar239 * fVar210,
                                     CONCAT44((fVar139 + fVar139) * (fVar238 + -5.0) +
                                              fVar238 * fVar139,
                                              (fVar192 + fVar192) * (fVar232 + -5.0) +
                                              fVar232 * fVar192))));
    auVar217._28_4_ = fVar242 + 0.0;
    auVar26._8_4_ = 0x40000000;
    auVar26._0_8_ = 0x4000000040000000;
    auVar26._12_4_ = 0x40000000;
    auVar26._16_4_ = 0x40000000;
    auVar26._20_4_ = 0x40000000;
    auVar26._24_4_ = 0x40000000;
    auVar26._28_4_ = 0x40000000;
    auVar96 = vaddps_avx512vl(auVar255._0_32_,auVar26);
    auVar45._4_4_ = (fVar213 + fVar213) * auVar96._4_4_;
    auVar45._0_4_ = (fVar212 + fVar212) * auVar96._0_4_;
    auVar45._8_4_ = (fVar214 + fVar214) * auVar96._8_4_;
    auVar45._12_4_ = (fVar224 + fVar224) * auVar96._12_4_;
    auVar45._16_4_ = (fVar171 + fVar171) * auVar96._16_4_;
    auVar45._20_4_ = (fVar225 + fVar225) * auVar96._20_4_;
    auVar45._24_4_ = (fVar226 + fVar226) * auVar96._24_4_;
    auVar45._28_4_ = auVar96._28_4_;
    auVar46._4_4_ = fVar213 * fVar213 * 3.0;
    auVar46._0_4_ = fVar212 * fVar212 * 3.0;
    auVar46._8_4_ = fVar214 * fVar214 * 3.0;
    auVar46._12_4_ = fVar224 * fVar224 * 3.0;
    auVar46._16_4_ = fVar171 * fVar171 * 3.0;
    auVar46._20_4_ = fVar225 * fVar225 * 3.0;
    auVar46._24_4_ = fVar226 * fVar226 * 3.0;
    auVar46._28_4_ = fVar170;
    auVar96 = vsubps_avx(auVar45,auVar46);
    auVar97 = vsubps_avx(ZEXT1632(CONCAT412(fVar211 * fVar211,
                                            CONCAT48(fVar210 * fVar210,
                                                     CONCAT44(fVar139 * fVar139,fVar192 * fVar192)))
                                 ),auVar44);
    auVar102 = vmulps_avx512vl(auVar99,auVar98);
    auVar103 = vmulps_avx512vl(auVar217,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar98);
    auVar97 = vmulps_avx512vl(auVar97,auVar98);
    fVar192 = auVar97._0_4_;
    fVar139 = auVar97._4_4_;
    auVar47._4_4_ = local_2c0._4_4_ * fVar139;
    auVar47._0_4_ = local_2c0._0_4_ * fVar192;
    fVar210 = auVar97._8_4_;
    auVar47._8_4_ = local_2c0._8_4_ * fVar210;
    fVar211 = auVar97._12_4_;
    auVar47._12_4_ = local_2c0._12_4_ * fVar211;
    fVar212 = auVar97._16_4_;
    auVar47._16_4_ = local_2c0._16_4_ * fVar212;
    fVar213 = auVar97._20_4_;
    auVar47._20_4_ = local_2c0._20_4_ * fVar213;
    fVar214 = auVar97._24_4_;
    auVar47._24_4_ = local_2c0._24_4_ * fVar214;
    auVar47._28_4_ = fVar242;
    auVar48._4_4_ = (float)local_220._4_4_ * fVar139;
    auVar48._0_4_ = (float)local_220._0_4_ * fVar192;
    auVar48._8_4_ = fStack_218 * fVar210;
    auVar48._12_4_ = fStack_214 * fVar211;
    auVar48._16_4_ = fStack_210 * fVar212;
    auVar48._20_4_ = fStack_20c * fVar213;
    auVar48._24_4_ = fStack_208 * fVar214;
    auVar48._28_4_ = auVar99._28_4_;
    auVar49._4_4_ = (float)local_240._4_4_ * fVar139;
    auVar49._0_4_ = (float)local_240._0_4_ * fVar192;
    auVar49._8_4_ = fStack_238 * fVar210;
    auVar49._12_4_ = fStack_234 * fVar211;
    auVar49._16_4_ = fStack_230 * fVar212;
    auVar49._20_4_ = fStack_22c * fVar213;
    auVar49._24_4_ = fStack_228 * fVar214;
    auVar49._28_4_ = auVar100._28_4_;
    auVar99 = vmulps_avx512vl(local_260,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar47,auVar96,auVar259._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar48,auVar96,auVar260._0_32_);
    auVar86 = vfmadd231ps_fma(auVar49,auVar96,local_1e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_200,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar252._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar254._0_32_);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar103,auVar256._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar258._0_32_,auVar103);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar248._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar249._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar250._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar251._0_32_,auVar102);
    auVar50._4_4_ = auVar96._4_4_ * fVar155;
    auVar50._0_4_ = auVar96._0_4_ * fVar155;
    auVar50._8_4_ = auVar96._8_4_ * fVar155;
    auVar50._12_4_ = auVar96._12_4_ * fVar155;
    auVar50._16_4_ = auVar96._16_4_ * fVar155;
    auVar50._20_4_ = auVar96._20_4_ * fVar155;
    auVar50._24_4_ = auVar96._24_4_ * fVar155;
    auVar50._28_4_ = auVar102._28_4_;
    auVar237 = ZEXT3264(auVar50);
    auVar51._4_4_ = auVar97._4_4_ * fVar155;
    auVar51._0_4_ = auVar97._0_4_ * fVar155;
    auVar51._8_4_ = auVar97._8_4_ * fVar155;
    auVar51._12_4_ = auVar97._12_4_ * fVar155;
    auVar51._16_4_ = auVar97._16_4_ * fVar155;
    auVar51._20_4_ = auVar97._20_4_ * fVar155;
    auVar51._24_4_ = auVar97._24_4_ * fVar155;
    auVar51._28_4_ = fVar170 + fVar170;
    auVar52._4_4_ = auVar98._4_4_ * fVar155;
    auVar52._0_4_ = auVar98._0_4_ * fVar155;
    auVar52._8_4_ = auVar98._8_4_ * fVar155;
    auVar52._12_4_ = auVar98._12_4_ * fVar155;
    auVar52._16_4_ = auVar98._16_4_ * fVar155;
    auVar52._20_4_ = auVar98._20_4_ * fVar155;
    auVar52._24_4_ = auVar98._24_4_ * fVar155;
    auVar52._28_4_ = auVar98._28_4_;
    fVar192 = fVar155 * auVar99._0_4_;
    fVar139 = fVar155 * auVar99._4_4_;
    auVar53._4_4_ = fVar139;
    auVar53._0_4_ = fVar192;
    fVar210 = fVar155 * auVar99._8_4_;
    auVar53._8_4_ = fVar210;
    fVar211 = fVar155 * auVar99._12_4_;
    auVar53._12_4_ = fVar211;
    fVar212 = fVar155 * auVar99._16_4_;
    auVar53._16_4_ = fVar212;
    fVar213 = fVar155 * auVar99._20_4_;
    auVar53._20_4_ = fVar213;
    fVar214 = fVar155 * auVar99._24_4_;
    auVar53._24_4_ = fVar214;
    auVar53._28_4_ = fVar155;
    auVar86 = vxorps_avx512vl(auVar256._0_16_,auVar256._0_16_);
    local_920 = vpermt2ps_avx512vl(local_6c0,_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar102 = vpermt2ps_avx512vl(local_5a0,_DAT_01fb9fc0,ZEXT1632(auVar86));
    auVar97 = ZEXT1632(auVar86);
    auVar104 = vpermt2ps_avx512vl(local_480,_DAT_01fb9fc0,auVar97);
    auVar218._0_4_ = auVar101._0_4_ + fVar192;
    auVar218._4_4_ = auVar101._4_4_ + fVar139;
    auVar218._8_4_ = auVar101._8_4_ + fVar210;
    auVar218._12_4_ = auVar101._12_4_ + fVar211;
    auVar218._16_4_ = auVar101._16_4_ + fVar212;
    auVar218._20_4_ = auVar101._20_4_ + fVar213;
    auVar218._24_4_ = auVar101._24_4_ + fVar214;
    auVar218._28_4_ = auVar101._28_4_ + fVar155;
    auVar99 = vmaxps_avx(auVar101,auVar218);
    auVar96 = vminps_avx(auVar101,auVar218);
    auVar103 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar97);
    auVar105 = vpermt2ps_avx512vl(auVar50,_DAT_01fb9fc0,auVar97);
    auVar106 = vpermt2ps_avx512vl(auVar51,_DAT_01fb9fc0,auVar97);
    auVar114 = ZEXT1632(auVar86);
    auVar95 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,auVar114);
    auVar97 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,auVar114);
    auVar97 = vsubps_avx(auVar103,auVar97);
    auVar107 = vsubps_avx512vl(local_920,local_6c0);
    auVar231 = ZEXT3264(auVar107);
    auVar98 = vsubps_avx(auVar102,local_5a0);
    auVar100 = vsubps_avx(auVar104,local_480);
    auVar101 = vmulps_avx512vl(auVar98,auVar52);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar51,auVar100);
    auVar108 = vmulps_avx512vl(auVar100,auVar50);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar52,auVar107);
    auVar93 = vmulps_avx512vl(auVar107,auVar51);
    auVar93 = vfmsub231ps_avx512vl(auVar93,auVar50,auVar98);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar108 = vfmadd231ps_avx512vl(auVar93,auVar108,auVar108);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar101,auVar101);
    auVar101 = vmulps_avx512vl(auVar100,auVar100);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
    auVar93 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar107);
    auVar94 = vrcp14ps_avx512vl(auVar93);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar109 = vfnmadd213ps_avx512vl(auVar94,auVar93,auVar101);
    auVar94 = vfmadd132ps_avx512vl(auVar109,auVar94,auVar94);
    auVar108 = vmulps_avx512vl(auVar108,auVar94);
    auVar109 = vmulps_avx512vl(auVar98,auVar95);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar106,auVar100);
    auVar110 = vmulps_avx512vl(auVar100,auVar105);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar95,auVar107);
    auVar111 = vmulps_avx512vl(auVar107,auVar106);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar105,auVar98);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar94 = vmulps_avx512vl(auVar109,auVar94);
    auVar108 = vmaxps_avx512vl(auVar108,auVar94);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar94 = vmaxps_avx512vl(auVar97,auVar103);
    auVar99 = vmaxps_avx512vl(auVar99,auVar94);
    auVar94 = vaddps_avx512vl(auVar108,auVar99);
    auVar99 = vminps_avx(auVar97,auVar103);
    auVar99 = vminps_avx(auVar96,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar108);
    auVar27._8_4_ = 0x3f800002;
    auVar27._0_8_ = 0x3f8000023f800002;
    auVar27._12_4_ = 0x3f800002;
    auVar27._16_4_ = 0x3f800002;
    auVar27._20_4_ = 0x3f800002;
    auVar27._24_4_ = 0x3f800002;
    auVar27._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar94,auVar27);
    auVar28._8_4_ = 0x3f7ffffc;
    auVar28._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar28._12_4_ = 0x3f7ffffc;
    auVar28._16_4_ = 0x3f7ffffc;
    auVar28._20_4_ = 0x3f7ffffc;
    auVar28._24_4_ = 0x3f7ffffc;
    auVar28._28_4_ = 0x3f7ffffc;
    local_960 = vmulps_avx512vl(auVar99,auVar28);
    auVar99 = vmulps_avx512vl(auVar96,auVar96);
    auVar96 = vrsqrt14ps_avx512vl(auVar93);
    auVar29._8_4_ = 0xbf000000;
    auVar29._0_8_ = 0xbf000000bf000000;
    auVar29._12_4_ = 0xbf000000;
    auVar29._16_4_ = 0xbf000000;
    auVar29._20_4_ = 0xbf000000;
    auVar29._24_4_ = 0xbf000000;
    auVar29._28_4_ = 0xbf000000;
    auVar97 = vmulps_avx512vl(auVar93,auVar29);
    fVar192 = auVar96._0_4_;
    fVar139 = auVar96._4_4_;
    fVar210 = auVar96._8_4_;
    fVar211 = auVar96._12_4_;
    fVar212 = auVar96._16_4_;
    fVar213 = auVar96._20_4_;
    fVar214 = auVar96._24_4_;
    auVar54._4_4_ = fVar139 * fVar139 * fVar139 * auVar97._4_4_;
    auVar54._0_4_ = fVar192 * fVar192 * fVar192 * auVar97._0_4_;
    auVar54._8_4_ = fVar210 * fVar210 * fVar210 * auVar97._8_4_;
    auVar54._12_4_ = fVar211 * fVar211 * fVar211 * auVar97._12_4_;
    auVar54._16_4_ = fVar212 * fVar212 * fVar212 * auVar97._16_4_;
    auVar54._20_4_ = fVar213 * fVar213 * fVar213 * auVar97._20_4_;
    auVar54._24_4_ = fVar214 * fVar214 * fVar214 * auVar97._24_4_;
    auVar54._28_4_ = auVar94._28_4_;
    auVar30._8_4_ = 0x3fc00000;
    auVar30._0_8_ = 0x3fc000003fc00000;
    auVar30._12_4_ = 0x3fc00000;
    auVar30._16_4_ = 0x3fc00000;
    auVar30._20_4_ = 0x3fc00000;
    auVar30._24_4_ = 0x3fc00000;
    auVar30._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar54,auVar96,auVar30);
    auVar97 = vmulps_avx512vl(auVar107,auVar96);
    auVar103 = vmulps_avx512vl(auVar98,auVar96);
    auVar108 = vmulps_avx512vl(auVar100,auVar96);
    auVar93 = vsubps_avx512vl(auVar114,local_6c0);
    auVar94 = vsubps_avx512vl(auVar114,local_5a0);
    auVar109 = vsubps_avx512vl(auVar114,local_480);
    auVar68._4_4_ = uStack_45c;
    auVar68._0_4_ = local_460;
    auVar68._8_4_ = uStack_458;
    auVar68._12_4_ = uStack_454;
    auVar68._16_4_ = uStack_450;
    auVar68._20_4_ = uStack_44c;
    auVar68._24_4_ = uStack_448;
    auVar68._28_4_ = uStack_444;
    auVar110 = vmulps_avx512vl(auVar68,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar257._0_32_,auVar94);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar253._0_32_,auVar93);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar94,auVar94);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar93,auVar93);
    auVar112 = vmulps_avx512vl(auVar68,auVar108);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,auVar257._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar97,auVar253._0_32_);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar103 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar103);
    auVar97 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar97);
    auVar103 = vmulps_avx512vl(auVar112,auVar112);
    auVar108 = vsubps_avx512vl(local_280,auVar103);
    auVar113 = vmulps_avx512vl(auVar112,auVar97);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar97,auVar97);
    local_4c0 = vsubps_avx512vl(auVar111,auVar113);
    auVar99 = vsubps_avx512vl(local_4c0,auVar99);
    local_6e0 = vmulps_avx512vl(auVar110,auVar110);
    auVar31._8_4_ = 0x40800000;
    auVar31._0_8_ = 0x4080000040800000;
    auVar31._12_4_ = 0x40800000;
    auVar31._16_4_ = 0x40800000;
    auVar31._20_4_ = 0x40800000;
    auVar31._24_4_ = 0x40800000;
    auVar31._28_4_ = 0x40800000;
    _local_4a0 = vmulps_avx512vl(auVar108,auVar31);
    auVar111 = vmulps_avx512vl(_local_4a0,auVar99);
    auVar111 = vsubps_avx512vl(local_6e0,auVar111);
    uVar82 = vcmpps_avx512vl(auVar111,auVar114,5);
    bVar73 = (byte)uVar82;
    if (bVar73 == 0) {
LAB_01a3aef1:
      auVar257 = ZEXT3264(local_780);
      auVar253 = ZEXT3264(local_760);
      auVar255 = ZEXT3264(auVar101);
      auVar244 = ZEXT3264(auVar104);
      auVar248 = ZEXT3264(local_820);
      auVar249 = ZEXT3264(local_840);
      auVar250 = ZEXT3264(local_860);
      auVar251 = ZEXT3264(local_880);
      auVar252 = ZEXT3264(local_8a0);
      auVar254 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      auVar259 = ZEXT3264(local_7a0);
      auVar260 = ZEXT3264(local_7c0);
    }
    else {
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar113 = vaddps_avx512vl(auVar108,auVar108);
      local_4e0 = vrcp14ps_avx512vl(auVar113);
      auVar101 = vfnmadd213ps_avx512vl(local_4e0,auVar113,auVar101);
      auVar101 = vfmadd132ps_avx512vl(auVar101,local_4e0,local_4e0);
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      local_660 = vxorps_avx512vl(auVar110,auVar32);
      auVar114 = vsubps_avx512vl(local_660,auVar111);
      auVar114 = vmulps_avx512vl(auVar114,auVar101);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      local_640 = vmulps_avx512vl(auVar111,auVar101);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vblendmps_avx512vl(auVar111,auVar114);
      auVar115._0_4_ =
           (uint)(bVar73 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar101._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar81 * auVar111._4_4_ | (uint)!bVar81 * auVar101._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar81 * auVar111._8_4_ | (uint)!bVar81 * auVar101._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar81 * auVar111._12_4_ | (uint)!bVar81 * auVar101._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar81 * auVar111._16_4_ | (uint)!bVar81 * auVar101._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar81 * auVar111._20_4_ | (uint)!bVar81 * auVar101._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar81 * auVar111._24_4_ | (uint)!bVar81 * auVar101._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar115._28_4_ = (uint)bVar81 * auVar111._28_4_ | (uint)!bVar81 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = vblendmps_avx512vl(auVar101,local_640);
      auVar116._0_4_ =
           (uint)(bVar73 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar101._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar81 * auVar111._4_4_ | (uint)!bVar81 * auVar101._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar81 * auVar111._8_4_ | (uint)!bVar81 * auVar101._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar81 * auVar111._12_4_ | (uint)!bVar81 * auVar101._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar81 * auVar111._16_4_ | (uint)!bVar81 * auVar101._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar81 * auVar111._20_4_ | (uint)!bVar81 * auVar101._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar81 * auVar111._24_4_ | (uint)!bVar81 * auVar101._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar116._28_4_ = (uint)bVar81 * auVar111._28_4_ | (uint)!bVar81 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar101);
      auVar103 = vmaxps_avx512vl(local_2a0,auVar101);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      auVar111 = vmulps_avx512vl(auVar103,auVar33);
      vandps_avx512vl(auVar108,auVar101);
      uVar80 = vcmpps_avx512vl(auVar111,auVar111,1);
      uVar82 = uVar82 & uVar80;
      bVar76 = (byte)uVar82;
      if (bVar76 != 0) {
        uVar80 = vcmpps_avx512vl(auVar99,_DAT_01f7b000,2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar108 = vblendmps_avx512vl(auVar99,auVar101);
        bVar77 = (byte)uVar80;
        uVar83 = (uint)(bVar77 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar111._0_4_;
        bVar81 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar132 = (uint)bVar81 * auVar108._4_4_ | (uint)!bVar81 * auVar111._4_4_;
        bVar81 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar133 = (uint)bVar81 * auVar108._8_4_ | (uint)!bVar81 * auVar111._8_4_;
        bVar81 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar134 = (uint)bVar81 * auVar108._12_4_ | (uint)!bVar81 * auVar111._12_4_;
        bVar81 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar135 = (uint)bVar81 * auVar108._16_4_ | (uint)!bVar81 * auVar111._16_4_;
        bVar81 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar136 = (uint)bVar81 * auVar108._20_4_ | (uint)!bVar81 * auVar111._20_4_;
        bVar81 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar137 = (uint)bVar81 * auVar108._24_4_ | (uint)!bVar81 * auVar111._24_4_;
        bVar81 = SUB81(uVar80 >> 7,0);
        uVar138 = (uint)bVar81 * auVar108._28_4_ | (uint)!bVar81 * auVar111._28_4_;
        auVar115._0_4_ = (bVar76 & 1) * uVar83 | !(bool)(bVar76 & 1) * auVar115._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar115._4_4_ = bVar81 * uVar132 | !bVar81 * auVar115._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar115._8_4_ = bVar81 * uVar133 | !bVar81 * auVar115._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar115._12_4_ = bVar81 * uVar134 | !bVar81 * auVar115._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar115._16_4_ = bVar81 * uVar135 | !bVar81 * auVar115._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar115._20_4_ = bVar81 * uVar136 | !bVar81 * auVar115._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar115._24_4_ = bVar81 * uVar137 | !bVar81 * auVar115._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar115._28_4_ = bVar81 * uVar138 | !bVar81 * auVar115._28_4_;
        auVar99 = vblendmps_avx512vl(auVar101,auVar99);
        bVar81 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
        bVar12 = SUB81(uVar80 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar77 & 1) * auVar99._0_4_ | !(bool)(bVar77 & 1) * uVar83) |
             !(bool)(bVar76 & 1) * auVar116._0_4_;
        bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar6 * ((uint)bVar81 * auVar99._4_4_ | !bVar81 * uVar132) |
             !bVar6 * auVar116._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar81 * ((uint)bVar7 * auVar99._8_4_ | !bVar7 * uVar133) |
             !bVar81 * auVar116._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar81 * ((uint)bVar8 * auVar99._12_4_ | !bVar8 * uVar134) |
             !bVar81 * auVar116._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar81 * ((uint)bVar9 * auVar99._16_4_ | !bVar9 * uVar135) |
             !bVar81 * auVar116._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar81 * ((uint)bVar10 * auVar99._20_4_ | !bVar10 * uVar136) |
             !bVar81 * auVar116._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar81 * ((uint)bVar11 * auVar99._24_4_ | !bVar11 * uVar137) |
             !bVar81 * auVar116._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar81 * ((uint)bVar12 * auVar99._28_4_ | !bVar12 * uVar138) |
             !bVar81 * auVar116._28_4_;
        bVar73 = (~bVar76 | bVar77) & bVar73;
      }
      auVar69._4_4_ = uStack_45c;
      auVar69._0_4_ = local_460;
      auVar69._8_4_ = uStack_458;
      auVar69._12_4_ = uStack_454;
      auVar69._16_4_ = uStack_450;
      auVar69._20_4_ = uStack_44c;
      auVar69._24_4_ = uStack_448;
      auVar69._28_4_ = uStack_444;
      if ((bVar73 & 0x7f) == 0) {
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        goto LAB_01a3aef1;
      }
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = vxorps_avx512vl(auVar95,auVar108);
      auVar117 = vxorps_avx512vl(auVar105,auVar108);
      auVar106 = vxorps_avx512vl(auVar106,auVar108);
      auVar86 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_550);
      auVar99 = vbroadcastss_avx512vl(auVar86);
      auVar105 = vmaxps_avx512vl(auVar99,auVar115);
      auVar86 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_550);
      auVar99 = vbroadcastss_avx512vl(auVar86);
      auVar118 = vminps_avx512vl(auVar99,auVar116);
      auVar99 = vmulps_avx512vl(auVar109,auVar52);
      auVar99 = vfmadd213ps_avx512vl(auVar94,auVar51,auVar99);
      auVar86 = vfmadd213ps_fma(auVar93,auVar50,auVar99);
      auVar99 = vmulps_avx512vl(auVar69,auVar52);
      auVar257 = ZEXT3264(local_780);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_780,auVar51);
      auVar93 = vfmadd231ps_avx512vl(auVar99,local_760,auVar50);
      auVar186._8_4_ = 0x7fffffff;
      auVar186._0_8_ = 0x7fffffff7fffffff;
      auVar186._12_4_ = 0x7fffffff;
      auVar186._16_4_ = 0x7fffffff;
      auVar186._20_4_ = 0x7fffffff;
      auVar186._24_4_ = 0x7fffffff;
      auVar186._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(auVar93,auVar186);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar99,auVar94,1);
      auVar99 = vxorps_avx512vl(ZEXT1632(auVar86),auVar108);
      auVar109 = vrcp14ps_avx512vl(auVar93);
      auVar119 = vxorps_avx512vl(auVar93,auVar108);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar120 = vfnmadd213ps_avx512vl(auVar109,auVar93,auVar101);
      auVar86 = vfmadd132ps_fma(auVar120,auVar109,auVar109);
      fVar192 = auVar86._0_4_ * auVar99._0_4_;
      fVar139 = auVar86._4_4_ * auVar99._4_4_;
      auVar55._4_4_ = fVar139;
      auVar55._0_4_ = fVar192;
      fVar210 = auVar86._8_4_ * auVar99._8_4_;
      auVar55._8_4_ = fVar210;
      fVar211 = auVar86._12_4_ * auVar99._12_4_;
      auVar55._12_4_ = fVar211;
      fVar212 = auVar99._16_4_ * 0.0;
      auVar55._16_4_ = fVar212;
      fVar213 = auVar99._20_4_ * 0.0;
      auVar55._20_4_ = fVar213;
      fVar214 = auVar99._24_4_ * 0.0;
      auVar55._24_4_ = fVar214;
      auVar55._28_4_ = auVar99._28_4_;
      uVar15 = vcmpps_avx512vl(auVar93,auVar119,1);
      bVar76 = (byte)uVar13 | (byte)uVar15;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar55,auVar120);
      auVar122._0_4_ =
           (uint)(bVar76 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar109._0_4_;
      bVar81 = (bool)(bVar76 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar81 * auVar121._4_4_ | (uint)!bVar81 * auVar109._4_4_;
      bVar81 = (bool)(bVar76 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar81 * auVar121._8_4_ | (uint)!bVar81 * auVar109._8_4_;
      bVar81 = (bool)(bVar76 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar81 * auVar121._12_4_ | (uint)!bVar81 * auVar109._12_4_;
      bVar81 = (bool)(bVar76 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar81 * auVar121._16_4_ | (uint)!bVar81 * auVar109._16_4_;
      bVar81 = (bool)(bVar76 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar81 * auVar121._20_4_ | (uint)!bVar81 * auVar109._20_4_;
      bVar81 = (bool)(bVar76 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar81 * auVar121._24_4_ | (uint)!bVar81 * auVar109._24_4_;
      auVar122._28_4_ =
           (uint)(bVar76 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar109._28_4_;
      auVar109 = vmaxps_avx512vl(auVar105,auVar122);
      uVar15 = vcmpps_avx512vl(auVar93,auVar119,6);
      bVar76 = (byte)uVar13 | (byte)uVar15;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123._0_4_ = (uint)(bVar76 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)fVar192
      ;
      bVar81 = (bool)(bVar76 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar81 * auVar93._4_4_ | (uint)!bVar81 * (int)fVar139;
      bVar81 = (bool)(bVar76 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar81 * auVar93._8_4_ | (uint)!bVar81 * (int)fVar210;
      bVar81 = (bool)(bVar76 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar81 * auVar93._12_4_ | (uint)!bVar81 * (int)fVar211;
      bVar81 = (bool)(bVar76 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar81 * auVar93._16_4_ | (uint)!bVar81 * (int)fVar212;
      bVar81 = (bool)(bVar76 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar81 * auVar93._20_4_ | (uint)!bVar81 * (int)fVar213;
      bVar81 = (bool)(bVar76 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar81 * auVar93._24_4_ | (uint)!bVar81 * (int)fVar214;
      auVar123._28_4_ =
           (uint)(bVar76 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar99._28_4_;
      auVar118 = vminps_avx512vl(auVar118,auVar123);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,local_920);
      auVar102 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
      auVar119 = ZEXT832(0) << 0x20;
      auVar105 = vsubps_avx(auVar119,auVar104);
      auVar105 = vmulps_avx512vl(auVar105,auVar95);
      auVar102 = vfmadd231ps_avx512vl(auVar105,auVar106,auVar102);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar99);
      auVar99 = vmulps_avx512vl(auVar69,auVar95);
      auVar253 = ZEXT3264(local_760);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_780,auVar106);
      auVar105 = vfmadd231ps_avx512vl(auVar99,local_760,auVar117);
      auVar99 = vandps_avx(auVar105,auVar186);
      uVar13 = vcmpps_avx512vl(auVar99,auVar94,1);
      auVar99 = vxorps_avx512vl(auVar102,auVar108);
      auVar102 = vrcp14ps_avx512vl(auVar105);
      auVar104 = vxorps_avx512vl(auVar105,auVar108);
      auVar106 = vfnmadd213ps_avx512vl(auVar102,auVar105,auVar101);
      auVar86 = vfmadd132ps_fma(auVar106,auVar102,auVar102);
      fVar192 = auVar86._0_4_ * auVar99._0_4_;
      fVar139 = auVar86._4_4_ * auVar99._4_4_;
      auVar56._4_4_ = fVar139;
      auVar56._0_4_ = fVar192;
      fVar210 = auVar86._8_4_ * auVar99._8_4_;
      auVar56._8_4_ = fVar210;
      fVar211 = auVar86._12_4_ * auVar99._12_4_;
      auVar56._12_4_ = fVar211;
      fVar212 = auVar99._16_4_ * 0.0;
      auVar56._16_4_ = fVar212;
      fVar213 = auVar99._20_4_ * 0.0;
      auVar56._20_4_ = fVar213;
      fVar214 = auVar99._24_4_ * 0.0;
      auVar56._24_4_ = fVar214;
      auVar56._28_4_ = auVar99._28_4_;
      uVar15 = vcmpps_avx512vl(auVar105,auVar104,1);
      bVar76 = (byte)uVar13 | (byte)uVar15;
      auVar106 = vblendmps_avx512vl(auVar56,auVar120);
      auVar124._0_4_ =
           (uint)(bVar76 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar102._0_4_;
      bVar81 = (bool)(bVar76 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar81 * auVar106._4_4_ | (uint)!bVar81 * auVar102._4_4_;
      bVar81 = (bool)(bVar76 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar81 * auVar106._8_4_ | (uint)!bVar81 * auVar102._8_4_;
      bVar81 = (bool)(bVar76 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar81 * auVar106._12_4_ | (uint)!bVar81 * auVar102._12_4_;
      bVar81 = (bool)(bVar76 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar81 * auVar106._16_4_ | (uint)!bVar81 * auVar102._16_4_;
      bVar81 = (bool)(bVar76 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar81 * auVar106._20_4_ | (uint)!bVar81 * auVar102._20_4_;
      bVar81 = (bool)(bVar76 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar81 * auVar106._24_4_ | (uint)!bVar81 * auVar102._24_4_;
      auVar124._28_4_ =
           (uint)(bVar76 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar102._28_4_;
      local_440 = vmaxps_avx(auVar109,auVar124);
      uVar15 = vcmpps_avx512vl(auVar105,auVar104,6);
      bVar76 = (byte)uVar13 | (byte)uVar15;
      auVar125._0_4_ = (uint)(bVar76 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * (int)fVar192
      ;
      bVar81 = (bool)(bVar76 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar81 * auVar93._4_4_ | (uint)!bVar81 * (int)fVar139;
      bVar81 = (bool)(bVar76 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar81 * auVar93._8_4_ | (uint)!bVar81 * (int)fVar210;
      bVar81 = (bool)(bVar76 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar81 * auVar93._12_4_ | (uint)!bVar81 * (int)fVar211;
      bVar81 = (bool)(bVar76 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar81 * auVar93._16_4_ | (uint)!bVar81 * (int)fVar212;
      bVar81 = (bool)(bVar76 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar81 * auVar93._20_4_ | (uint)!bVar81 * (int)fVar213;
      bVar81 = (bool)(bVar76 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar81 * auVar93._24_4_ | (uint)!bVar81 * (int)fVar214;
      auVar125._28_4_ =
           (uint)(bVar76 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar99._28_4_;
      local_360 = vminps_avx(auVar118,auVar125);
      auVar237 = ZEXT3264(local_360);
      uVar13 = vcmpps_avx512vl(local_440,local_360,2);
      bVar73 = bVar73 & 0x7f & (byte)uVar13;
      if (bVar73 == 0) goto LAB_01a3aef1;
      auVar99 = vmaxps_avx(auVar119,local_960);
      auVar102 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar97);
      auVar102 = vmulps_avx512vl(auVar96,auVar102);
      auVar105 = vfmadd213ps_avx512vl(local_640,auVar112,auVar97);
      fVar192 = auVar96._0_4_;
      fVar139 = auVar96._4_4_;
      auVar57._4_4_ = fVar139 * auVar105._4_4_;
      auVar57._0_4_ = fVar192 * auVar105._0_4_;
      fVar210 = auVar96._8_4_;
      auVar57._8_4_ = fVar210 * auVar105._8_4_;
      fVar211 = auVar96._12_4_;
      auVar57._12_4_ = fVar211 * auVar105._12_4_;
      fVar212 = auVar96._16_4_;
      auVar57._16_4_ = fVar212 * auVar105._16_4_;
      fVar213 = auVar96._20_4_;
      auVar57._20_4_ = fVar213 * auVar105._20_4_;
      fVar214 = auVar96._24_4_;
      auVar57._24_4_ = fVar214 * auVar105._24_4_;
      auVar57._28_4_ = local_440._28_4_;
      auVar102 = vminps_avx512vl(auVar102,auVar101);
      auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
      auVar106 = vminps_avx512vl(auVar57,auVar101);
      auVar58._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar102._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar58,local_580,local_740);
      auVar102 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      auVar59._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar102._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar59,local_580,local_740);
      auVar60._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar60._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar60._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar60._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar60._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar60._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar60._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar60._28_4_ = auVar99._28_4_;
      auVar102 = vsubps_avx(local_4c0,auVar60);
      auVar61._4_4_ = auVar102._4_4_ * (float)local_4a0._4_4_;
      auVar61._0_4_ = auVar102._0_4_ * (float)local_4a0._0_4_;
      auVar61._8_4_ = auVar102._8_4_ * fStack_498;
      auVar61._12_4_ = auVar102._12_4_ * fStack_494;
      auVar61._16_4_ = auVar102._16_4_ * fStack_490;
      auVar61._20_4_ = auVar102._20_4_ * fStack_48c;
      auVar61._24_4_ = auVar102._24_4_ * fStack_488;
      auVar61._28_4_ = auVar99._28_4_;
      auVar99 = vsubps_avx(local_6e0,auVar61);
      uVar13 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
      bVar76 = (byte)uVar13;
      auVar259 = ZEXT3264(local_7a0);
      auVar260 = ZEXT3264(local_7c0);
      if (bVar76 == 0) {
        bVar76 = 0;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar255 = ZEXT864(0) << 0x20;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar126._8_4_ = 0x7f800000;
        auVar126._0_8_ = 0x7f8000007f800000;
        auVar126._12_4_ = 0x7f800000;
        auVar126._16_4_ = 0x7f800000;
        auVar126._20_4_ = 0x7f800000;
        auVar126._24_4_ = 0x7f800000;
        auVar126._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        auVar87 = vxorps_avx512vl(auVar141,auVar141);
        uVar82 = vcmpps_avx512vl(auVar99,auVar119,5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar101 = vfnmadd213ps_avx512vl(auVar113,local_4e0,auVar101);
        auVar105 = vfmadd132ps_avx512vl(auVar101,local_4e0,local_4e0);
        auVar101 = vsubps_avx(local_660,auVar99);
        auVar95 = vmulps_avx512vl(auVar101,auVar105);
        auVar99 = vsubps_avx512vl(auVar99,auVar110);
        auVar108 = vmulps_avx512vl(auVar99,auVar105);
        auVar99 = vfmadd213ps_avx512vl(auVar112,auVar95,auVar97);
        auVar62._4_4_ = fVar139 * auVar99._4_4_;
        auVar62._0_4_ = fVar192 * auVar99._0_4_;
        auVar62._8_4_ = fVar210 * auVar99._8_4_;
        auVar62._12_4_ = fVar211 * auVar99._12_4_;
        auVar62._16_4_ = fVar212 * auVar99._16_4_;
        auVar62._20_4_ = fVar213 * auVar99._20_4_;
        auVar62._24_4_ = fVar214 * auVar99._24_4_;
        auVar62._28_4_ = auVar106._28_4_;
        auVar99 = vmulps_avx512vl(local_760,auVar95);
        auVar105 = vmulps_avx512vl(local_780,auVar95);
        auVar70._4_4_ = uStack_45c;
        auVar70._0_4_ = local_460;
        auVar70._8_4_ = uStack_458;
        auVar70._12_4_ = uStack_454;
        auVar70._16_4_ = uStack_450;
        auVar70._20_4_ = uStack_44c;
        auVar70._24_4_ = uStack_448;
        auVar70._28_4_ = uStack_444;
        auVar93 = vmulps_avx512vl(auVar70,auVar95);
        auVar101 = vfmadd213ps_avx512vl(auVar107,auVar62,local_6c0);
        auVar101 = vsubps_avx512vl(auVar99,auVar101);
        auVar99 = vfmadd213ps_avx512vl(auVar98,auVar62,local_5a0);
        auVar106 = vsubps_avx512vl(auVar105,auVar99);
        auVar86 = vfmadd213ps_fma(auVar62,auVar100,local_480);
        auVar99 = vsubps_avx(auVar93,ZEXT1632(auVar86));
        auVar241 = auVar99._0_28_;
        auVar99 = vfmadd213ps_avx512vl(auVar112,auVar108,auVar97);
        auVar63._4_4_ = fVar139 * auVar99._4_4_;
        auVar63._0_4_ = fVar192 * auVar99._0_4_;
        auVar63._8_4_ = fVar210 * auVar99._8_4_;
        auVar63._12_4_ = fVar211 * auVar99._12_4_;
        auVar63._16_4_ = fVar212 * auVar99._16_4_;
        auVar63._20_4_ = fVar213 * auVar99._20_4_;
        auVar63._24_4_ = fVar214 * auVar99._24_4_;
        auVar63._28_4_ = auVar96._28_4_;
        auVar99 = vmulps_avx512vl(local_760,auVar108);
        auVar96 = vmulps_avx512vl(local_780,auVar108);
        auVar97 = vmulps_avx512vl(auVar70,auVar108);
        auVar86 = vfmadd213ps_fma(auVar107,auVar63,local_6c0);
        auVar105 = vsubps_avx(auVar99,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar98,auVar63,local_5a0);
        auVar99 = vsubps_avx(auVar96,ZEXT1632(auVar86));
        auVar86 = vfmadd213ps_fma(auVar100,auVar63,local_480);
        auVar96 = vsubps_avx512vl(auVar97,ZEXT1632(auVar86));
        auVar255 = ZEXT3264(auVar96);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar149,auVar95);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar126._0_4_ = (uint)bVar81 * auVar96._0_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * 0x7f800000;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar126._28_4_ = (uint)bVar81 * auVar96._28_4_ | (uint)!bVar81 * 0x7f800000;
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar96 = vblendmps_avx512vl(auVar187,auVar108);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar127._0_4_ = (uint)bVar81 * auVar96._0_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar127._28_4_ = (uint)bVar81 * auVar96._28_4_ | (uint)!bVar81 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar96 = vmulps_avx512vl(auVar103,auVar34);
        uVar80 = vcmpps_avx512vl(auVar111,auVar96,1);
        uVar82 = uVar82 & uVar80;
        bVar77 = (byte)uVar82;
        if (bVar77 != 0) {
          uVar80 = vcmpps_avx512vl(auVar102,ZEXT1632(auVar87),2);
          auVar229._8_4_ = 0x7f800000;
          auVar229._0_8_ = 0x7f8000007f800000;
          auVar229._12_4_ = 0x7f800000;
          auVar229._16_4_ = 0x7f800000;
          auVar229._20_4_ = 0x7f800000;
          auVar229._24_4_ = 0x7f800000;
          auVar229._28_4_ = 0x7f800000;
          auVar245._8_4_ = 0xff800000;
          auVar245._0_8_ = 0xff800000ff800000;
          auVar245._12_4_ = 0xff800000;
          auVar245._16_4_ = 0xff800000;
          auVar245._20_4_ = 0xff800000;
          auVar245._24_4_ = 0xff800000;
          auVar245._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar229,auVar245);
          bVar74 = (byte)uVar80;
          uVar83 = (uint)(bVar74 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar96._0_4_;
          bVar81 = (bool)((byte)(uVar80 >> 1) & 1);
          uVar132 = (uint)bVar81 * auVar97._4_4_ | (uint)!bVar81 * auVar96._4_4_;
          bVar81 = (bool)((byte)(uVar80 >> 2) & 1);
          uVar133 = (uint)bVar81 * auVar97._8_4_ | (uint)!bVar81 * auVar96._8_4_;
          bVar81 = (bool)((byte)(uVar80 >> 3) & 1);
          uVar134 = (uint)bVar81 * auVar97._12_4_ | (uint)!bVar81 * auVar96._12_4_;
          bVar81 = (bool)((byte)(uVar80 >> 4) & 1);
          uVar135 = (uint)bVar81 * auVar97._16_4_ | (uint)!bVar81 * auVar96._16_4_;
          bVar81 = (bool)((byte)(uVar80 >> 5) & 1);
          uVar136 = (uint)bVar81 * auVar97._20_4_ | (uint)!bVar81 * auVar96._20_4_;
          bVar81 = (bool)((byte)(uVar80 >> 6) & 1);
          uVar137 = (uint)bVar81 * auVar97._24_4_ | (uint)!bVar81 * auVar96._24_4_;
          bVar81 = SUB81(uVar80 >> 7,0);
          uVar138 = (uint)bVar81 * auVar97._28_4_ | (uint)!bVar81 * auVar96._28_4_;
          auVar126._0_4_ = (bVar77 & 1) * uVar83 | !(bool)(bVar77 & 1) * auVar126._0_4_;
          bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar126._4_4_ = bVar81 * uVar132 | !bVar81 * auVar126._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar126._8_4_ = bVar81 * uVar133 | !bVar81 * auVar126._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar126._12_4_ = bVar81 * uVar134 | !bVar81 * auVar126._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar126._16_4_ = bVar81 * uVar135 | !bVar81 * auVar126._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar126._20_4_ = bVar81 * uVar136 | !bVar81 * auVar126._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar126._24_4_ = bVar81 * uVar137 | !bVar81 * auVar126._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar126._28_4_ = bVar81 * uVar138 | !bVar81 * auVar126._28_4_;
          auVar96 = vblendmps_avx512vl(auVar245,auVar229);
          bVar81 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar80 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar80 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar80 >> 6) & 1);
          bVar12 = SUB81(uVar80 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar77 & 1) *
               ((uint)(bVar74 & 1) * auVar96._0_4_ | !(bool)(bVar74 & 1) * uVar83) |
               !(bool)(bVar77 & 1) * auVar127._0_4_;
          bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar6 * ((uint)bVar81 * auVar96._4_4_ | !bVar81 * uVar132) |
               !bVar6 * auVar127._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar81 * ((uint)bVar7 * auVar96._8_4_ | !bVar7 * uVar133) |
               !bVar81 * auVar127._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar81 * ((uint)bVar8 * auVar96._12_4_ | !bVar8 * uVar134) |
               !bVar81 * auVar127._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar81 * ((uint)bVar9 * auVar96._16_4_ | !bVar9 * uVar135) |
               !bVar81 * auVar127._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar81 * ((uint)bVar10 * auVar96._20_4_ | !bVar10 * uVar136) |
               !bVar81 * auVar127._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar81 * ((uint)bVar11 * auVar96._24_4_ | !bVar11 * uVar137) |
               !bVar81 * auVar127._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar81 * ((uint)bVar12 * auVar96._28_4_ | !bVar12 * uVar138) |
               !bVar81 * auVar127._28_4_;
          bVar76 = (~bVar77 | bVar74) & bVar76;
        }
      }
      auVar248 = ZEXT3264(local_820);
      auVar249 = ZEXT3264(local_840);
      auVar250 = ZEXT3264(local_860);
      auVar251 = ZEXT3264(local_880);
      auVar252 = ZEXT3264(local_8a0);
      auVar254 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_900);
      uVar140 = *(undefined4 *)&(ray->dir).field_0;
      auVar223._4_4_ = uVar140;
      auVar223._0_4_ = uVar140;
      auVar223._8_4_ = uVar140;
      auVar223._12_4_ = uVar140;
      auVar223._16_4_ = uVar140;
      auVar223._20_4_ = uVar140;
      auVar223._24_4_ = uVar140;
      auVar223._28_4_ = uVar140;
      uVar140 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar230._4_4_ = uVar140;
      auVar230._0_4_ = uVar140;
      auVar230._8_4_ = uVar140;
      auVar230._12_4_ = uVar140;
      auVar230._16_4_ = uVar140;
      auVar230._20_4_ = uVar140;
      auVar230._24_4_ = uVar140;
      auVar230._28_4_ = uVar140;
      auVar231 = ZEXT3264(auVar230);
      fVar192 = (ray->dir).field_0.m128[2];
      auVar244._0_4_ = fVar192 * auVar255._0_4_;
      auVar244._4_4_ = fVar192 * auVar255._4_4_;
      auVar244._8_4_ = fVar192 * auVar255._8_4_;
      auVar244._12_4_ = fVar192 * auVar255._12_4_;
      auVar244._16_4_ = fVar192 * auVar255._16_4_;
      auVar244._20_4_ = fVar192 * auVar255._20_4_;
      auVar244._28_36_ = auVar255._28_36_;
      auVar244._24_4_ = fVar192 * auVar255._24_4_;
      auVar86 = vfmadd231ps_fma(auVar244._0_32_,auVar230,auVar99);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar223,auVar105);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar244 = ZEXT3264(auVar243);
      auVar99 = vandps_avx(auVar243,ZEXT1632(auVar86));
      _local_340 = local_440;
      auVar222._8_4_ = 0x3e99999a;
      auVar222._0_8_ = 0x3e99999a3e99999a;
      auVar222._12_4_ = 0x3e99999a;
      auVar222._16_4_ = 0x3e99999a;
      auVar222._20_4_ = 0x3e99999a;
      auVar222._24_4_ = 0x3e99999a;
      auVar222._28_4_ = 0x3e99999a;
      uVar13 = vcmpps_avx512vl(auVar99,auVar222,1);
      _local_400 = vmaxps_avx(local_440,auVar127);
      auVar99 = vminps_avx(local_360,auVar126);
      uVar15 = vcmpps_avx512vl(local_440,auVar99,2);
      bVar77 = (byte)uVar15 & bVar73;
      uVar14 = vcmpps_avx512vl(_local_400,local_360,2);
      if ((bVar73 & ((byte)uVar14 | (byte)uVar15)) == 0) {
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar99);
      }
      else {
        local_7c8 = (uint)(byte)((byte)uVar13 | ~bVar76);
        auVar64._4_4_ = auVar241._4_4_ * fVar192;
        auVar64._0_4_ = auVar241._0_4_ * fVar192;
        auVar64._8_4_ = auVar241._8_4_ * fVar192;
        auVar64._12_4_ = auVar241._12_4_ * fVar192;
        auVar64._16_4_ = auVar241._16_4_ * fVar192;
        auVar64._20_4_ = auVar241._20_4_ * fVar192;
        auVar64._24_4_ = auVar241._24_4_ * fVar192;
        auVar64._28_4_ = auVar99._28_4_;
        auVar86 = vfmadd213ps_fma(auVar106,auVar230,auVar64);
        auVar86 = vfmadd213ps_fma(auVar101,auVar223,ZEXT1632(auVar86));
        auVar99 = vandps_avx(auVar243,ZEXT1632(auVar86));
        uVar13 = vcmpps_avx512vl(auVar99,auVar222,1);
        bVar76 = (byte)uVar13 | ~bVar76;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar152,auVar35);
        local_300._0_4_ = (uint)(bVar76 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
        bVar81 = (bool)(bVar76 >> 1 & 1);
        local_300._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar76 >> 2 & 1);
        local_300._8_4_ = (uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar76 >> 3 & 1);
        local_300._12_4_ = (uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar76 >> 4 & 1);
        local_300._16_4_ = (uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar76 >> 5 & 1);
        local_300._20_4_ = (uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar76 >> 6 & 1);
        local_300._24_4_ = (uint)bVar81 * auVar99._24_4_ | (uint)!bVar81 * 2;
        local_300._28_4_ = (uint)(bVar76 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar13 = vpcmpd_avx512vl(local_3a0,local_300,5);
        local_7c4 = (uint)bVar77;
        local_3e0 = local_440._0_4_ + (float)local_420._0_4_;
        fStack_3dc = local_440._4_4_ + (float)local_420._4_4_;
        fStack_3d8 = local_440._8_4_ + fStack_418;
        fStack_3d4 = local_440._12_4_ + fStack_414;
        fStack_3d0 = local_440._16_4_ + fStack_410;
        fStack_3cc = local_440._20_4_ + fStack_40c;
        fStack_3c8 = local_440._24_4_ + fStack_408;
        fStack_3c4 = local_440._28_4_ + fStack_404;
        _local_380 = _local_400;
        for (bVar77 = (byte)uVar13 & bVar77; auVar99 = local_920, bVar77 != 0;
            bVar77 = ~bVar76 & bVar77 & (byte)uVar13) {
          auVar153._8_4_ = 0x7f800000;
          auVar153._0_8_ = 0x7f8000007f800000;
          auVar153._12_4_ = 0x7f800000;
          auVar153._16_4_ = 0x7f800000;
          auVar153._20_4_ = 0x7f800000;
          auVar153._24_4_ = 0x7f800000;
          auVar153._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar153,local_440);
          auVar129._0_4_ =
               (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 1 & 1);
          auVar129._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 2 & 1);
          auVar129._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 3 & 1);
          auVar129._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 4 & 1);
          auVar129._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 5 & 1);
          auVar129._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar77 >> 6 & 1);
          auVar129._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * 0x7f800000;
          auVar129._28_4_ =
               (uint)(bVar77 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
          auVar96 = vminps_avx(auVar129,auVar96);
          auVar97 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar97);
          auVar97 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar97);
          uVar13 = vcmpps_avx512vl(auVar129,auVar96,0);
          bVar74 = (byte)uVar13 & bVar77;
          bVar76 = bVar77;
          if (bVar74 != 0) {
            bVar76 = bVar74;
          }
          iVar16 = 0;
          for (uVar83 = (uint)bVar76; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar16 = iVar16 + 1;
          }
          bVar76 = '\x01' << ((byte)iVar16 & 0x1f);
          auVar231 = ZEXT464(*(uint *)(local_340 + (uint)(iVar16 << 2)));
          aVar1 = (ray->dir).field_0;
          local_580._0_16_ = (undefined1  [16])aVar1;
          auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar86._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar77;
            local_920._2_30_ = auVar99._2_30_;
            local_960._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar16 << 2)));
            local_740._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar16 << 2)));
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            fVar192 = sqrtf(auVar86._0_4_);
            auVar231 = ZEXT1664(local_740._0_16_);
            bVar77 = local_920[0];
            auVar260 = ZEXT3264(local_7c0);
            auVar259 = ZEXT3264(local_7a0);
            auVar258 = ZEXT3264(local_900);
            auVar256 = ZEXT3264(local_8e0);
            auVar254 = ZEXT3264(local_8c0);
            auVar252 = ZEXT3264(local_8a0);
            auVar251 = ZEXT3264(local_880);
            auVar250 = ZEXT3264(local_860);
            auVar249 = ZEXT3264(local_840);
            auVar248 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_780);
            auVar253 = ZEXT3264(local_760);
            auVar86 = local_960._0_16_;
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar192 = auVar86._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar16 << 2)));
          }
          uVar82 = (ulong)bVar76;
          auVar84 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar87 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar91 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar85 = vminps_avx(auVar84,auVar91);
          auVar84 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar91 = vmaxps_avx(auVar87,auVar84);
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar85,auVar193);
          auVar84 = vandps_avx(auVar91,auVar193);
          auVar87 = vmaxps_avx(auVar87,auVar84);
          auVar84 = vmovshdup_avx(auVar87);
          auVar84 = vmaxss_avx(auVar84,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar84);
          fVar139 = auVar87._0_4_ * 1.9073486e-06;
          local_540 = vshufps_avx(auVar91,auVar91,0xff);
          auVar86 = vinsertps_avx(auVar231._0_16_,auVar86,0x10);
          uVar80 = 0;
          while( true ) {
            bVar74 = (byte)uVar82;
            if (uVar80 == 5) break;
            uVar140 = auVar86._0_4_;
            auVar143._4_4_ = uVar140;
            auVar143._0_4_ = uVar140;
            auVar143._8_4_ = uVar140;
            auVar143._12_4_ = uVar140;
            auVar84 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_580._0_16_);
            auVar87 = vmovshdup_avx(auVar86);
            fVar214 = auVar87._0_4_;
            fVar155 = 1.0 - fVar214;
            fVar210 = fVar214 * fVar214;
            auVar234 = SUB6416(ZEXT464(0x40400000),0);
            auVar89 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar85 = vfmadd213ss_fma(auVar234,auVar87,auVar89);
            auVar91 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar210),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar88 = vfmadd213ss_fma(auVar234,ZEXT416((uint)fVar155),auVar89);
            auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar155 * fVar155)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar211 = fVar155 * fVar155 * -fVar214 * 0.5;
            fVar212 = auVar91._0_4_ * 0.5;
            fVar213 = auVar88._0_4_ * 0.5;
            fVar214 = fVar214 * fVar214 * -fVar155 * 0.5;
            auVar194._0_4_ = fVar214 * (float)local_620._0_4_;
            auVar194._4_4_ = fVar214 * (float)local_620._4_4_;
            auVar194._8_4_ = fVar214 * fStack_618;
            auVar194._12_4_ = fVar214 * fStack_614;
            auVar215._4_4_ = fVar213;
            auVar215._0_4_ = fVar213;
            auVar215._8_4_ = fVar213;
            auVar215._12_4_ = fVar213;
            auVar91 = vfmadd132ps_fma(auVar215,auVar194,local_5e0._0_16_);
            auVar172._4_4_ = fVar212;
            auVar172._0_4_ = fVar212;
            auVar172._8_4_ = fVar212;
            auVar172._12_4_ = fVar212;
            auVar91 = vfmadd132ps_fma(auVar172,auVar91,local_600._0_16_);
            auVar195._4_4_ = fVar211;
            auVar195._0_4_ = fVar211;
            auVar195._8_4_ = fVar211;
            auVar195._12_4_ = fVar211;
            auVar91 = vfmadd132ps_fma(auVar195,auVar91,local_5c0._0_16_);
            auVar88 = vfmadd231ss_fma(auVar89,auVar87,ZEXT416(0x41100000));
            _local_4a0 = auVar88;
            auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar87,ZEXT416(0x40800000));
            local_4c0._0_16_ = auVar88;
            local_920._0_16_ = auVar87;
            auVar87 = vfmadd213ss_fma(auVar234,auVar87,ZEXT416(0xbf800000));
            local_4e0._0_16_ = auVar87;
            local_480._0_16_ = auVar91;
            auVar87 = vsubps_avx(auVar84,auVar91);
            local_960._0_16_ = auVar87;
            auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
            local_740._0_16_ = auVar87;
            local_5a0._0_16_ = auVar86;
            if (auVar87._0_4_ < 0.0) {
              local_6c0._0_4_ = auVar85._0_4_;
              local_6e0._0_16_ = ZEXT416((uint)fVar155);
              local_640._0_4_ = fVar210;
              local_660._0_4_ = fVar155 * -2.0;
              auVar231._0_4_ = sqrtf(auVar87._0_4_);
              auVar231._4_60_ = extraout_var;
              auVar85 = ZEXT416((uint)local_6c0._0_4_);
              auVar86 = auVar231._0_16_;
              uVar82 = extraout_RAX;
              auVar87 = local_6e0._0_16_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar87,auVar87);
              local_660._0_4_ = fVar155 * -2.0;
              local_640._0_4_ = fVar210;
              auVar87 = ZEXT416((uint)fVar155);
            }
            fVar211 = auVar87._0_4_;
            fVar210 = local_920._0_4_;
            auVar88 = vfnmadd231ss_fma(ZEXT416((uint)(fVar210 * (fVar211 + fVar211))),auVar87,
                                       auVar87);
            auVar87 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar210 + fVar210)),
                                      ZEXT416((uint)(fVar210 * fVar210 * 3.0)));
            auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_920._0_16_,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                      ZEXT416((uint)(fVar211 + fVar211)),auVar84);
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)local_660._0_4_),local_920._0_16_,
                                      ZEXT416((uint)local_640._0_4_));
            fVar210 = auVar88._0_4_ * 0.5;
            fVar211 = auVar87._0_4_ * 0.5;
            fVar212 = auVar91._0_4_ * 0.5;
            fVar213 = auVar84._0_4_ * 0.5;
            auVar196._0_4_ = fVar213 * (float)local_620._0_4_;
            auVar196._4_4_ = fVar213 * (float)local_620._4_4_;
            auVar196._8_4_ = fVar213 * fStack_618;
            auVar196._12_4_ = fVar213 * fStack_614;
            auVar173._4_4_ = fVar212;
            auVar173._0_4_ = fVar212;
            auVar173._8_4_ = fVar212;
            auVar173._12_4_ = fVar212;
            auVar87 = vfmadd132ps_fma(auVar173,auVar196,local_5e0._0_16_);
            auVar156._4_4_ = fVar211;
            auVar156._0_4_ = fVar211;
            auVar156._8_4_ = fVar211;
            auVar156._12_4_ = fVar211;
            auVar87 = vfmadd132ps_fma(auVar156,auVar87,local_600._0_16_);
            auVar246._4_4_ = fVar210;
            auVar246._0_4_ = fVar210;
            auVar246._8_4_ = fVar210;
            auVar246._12_4_ = fVar210;
            local_6c0._0_16_ = vfmadd132ps_fma(auVar246,auVar87,local_5c0._0_16_);
            local_640._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
            auVar65._12_4_ = 0;
            auVar65._0_12_ = ZEXT812(0);
            fVar210 = local_640._0_4_;
            local_7e0 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar210));
            fVar211 = local_7e0._0_4_;
            local_660._0_16_ = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar210));
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(local_640._0_16_,auVar18);
            auVar87 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_6e0._0_4_ = auVar86._0_4_;
            if (fVar210 < auVar84._0_4_) {
              local_7f0._0_4_ = fVar210 * -0.5;
              fVar212 = sqrtf(fVar210);
              auVar86 = ZEXT416((uint)local_6e0._0_4_);
              uVar82 = extraout_RAX_00;
              fVar210 = (float)local_7f0._0_4_;
              auVar84 = local_6c0._0_16_;
            }
            else {
              auVar84 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
              fVar212 = auVar84._0_4_;
              fVar210 = fVar210 * -0.5;
              auVar84 = local_6c0._0_16_;
            }
            fVar213 = local_7e0._0_4_;
            fVar210 = fVar211 * 1.5 + fVar210 * fVar213 * fVar213 * fVar213;
            local_7e0._0_4_ = auVar84._0_4_ * fVar210;
            local_7e0._4_4_ = auVar84._4_4_ * fVar210;
            local_7e0._8_4_ = auVar84._8_4_ * fVar210;
            local_7e0._12_4_ = auVar84._12_4_ * fVar210;
            auVar91 = vdpps_avx(local_960._0_16_,local_7e0,0x7f);
            fVar214 = auVar86._0_4_;
            auVar144._0_4_ = auVar91._0_4_ * auVar91._0_4_;
            auVar144._4_4_ = auVar91._4_4_ * auVar91._4_4_;
            auVar144._8_4_ = auVar91._8_4_ * auVar91._8_4_;
            auVar144._12_4_ = auVar91._12_4_ * auVar91._12_4_;
            auVar88 = vsubps_avx512vl(local_740._0_16_,auVar144);
            fVar213 = auVar88._0_4_;
            auVar157._4_12_ = ZEXT812(0) << 0x20;
            auVar157._0_4_ = fVar213;
            auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
            fVar211 = auVar85._0_4_ * 1.5;
            auVar89 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
            if (fVar213 < 0.0) {
              local_500._0_4_ = fVar212;
              local_520._0_4_ = fVar211;
              local_7f0 = auVar91;
              local_530 = fVar210;
              fStack_52c = fVar210;
              fStack_528 = fVar210;
              fStack_524 = fVar210;
              local_510 = auVar85;
              fVar213 = sqrtf(fVar213);
              auVar89 = ZEXT416(auVar89._0_4_);
              auVar86 = ZEXT416((uint)local_6e0._0_4_);
              uVar82 = extraout_RAX_01;
              auVar85 = local_510;
              auVar88 = local_960._0_16_;
              auVar84 = local_6c0._0_16_;
              auVar91 = local_7f0;
              fVar211 = (float)local_520._0_4_;
              fVar210 = local_530;
              fVar155 = fStack_52c;
              fVar170 = fStack_528;
              fVar224 = fStack_524;
              fVar212 = (float)local_500._0_4_;
            }
            else {
              auVar88 = vsqrtss_avx(auVar88,auVar88);
              fVar213 = auVar88._0_4_;
              auVar88 = local_960._0_16_;
              fVar155 = fVar210;
              fVar170 = fVar210;
              fVar224 = fVar210;
            }
            auVar244 = ZEXT1664(auVar88);
            auVar253 = ZEXT3264(local_760);
            auVar257 = ZEXT3264(local_780);
            auVar248 = ZEXT3264(local_820);
            auVar249 = ZEXT3264(local_840);
            auVar250 = ZEXT3264(local_860);
            auVar251 = ZEXT3264(local_880);
            auVar252 = ZEXT3264(local_8a0);
            auVar254 = ZEXT3264(local_8c0);
            auVar256 = ZEXT3264(local_8e0);
            auVar258 = ZEXT3264(local_900);
            auVar259 = ZEXT3264(local_7a0);
            auVar260 = ZEXT3264(local_7c0);
            auVar158._0_4_ = (float)local_4e0._0_4_ * (float)local_620._0_4_;
            auVar158._4_4_ = (float)local_4e0._0_4_ * (float)local_620._4_4_;
            auVar158._8_4_ = (float)local_4e0._0_4_ * fStack_618;
            auVar158._12_4_ = (float)local_4e0._0_4_ * fStack_614;
            auVar174._4_4_ = local_4c0._0_4_;
            auVar174._0_4_ = local_4c0._0_4_;
            auVar174._8_4_ = local_4c0._0_4_;
            auVar174._12_4_ = local_4c0._0_4_;
            auVar234 = vfmadd132ps_fma(auVar174,auVar158,local_5e0._0_16_);
            auVar159._4_4_ = local_4a0._0_4_;
            auVar159._0_4_ = local_4a0._0_4_;
            auVar159._8_4_ = local_4a0._0_4_;
            auVar159._12_4_ = local_4a0._0_4_;
            auVar234 = vfmadd132ps_fma(auVar159,auVar234,local_600._0_16_);
            auVar3 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                     ZEXT416(0x40000000));
            uVar140 = auVar3._0_4_;
            auVar175._4_4_ = uVar140;
            auVar175._0_4_ = uVar140;
            auVar175._8_4_ = uVar140;
            auVar175._12_4_ = uVar140;
            auVar234 = vfmadd132ps_fma(auVar175,auVar234,local_5c0._0_16_);
            auVar160._0_4_ = auVar234._0_4_ * (float)local_640._0_4_;
            auVar160._4_4_ = auVar234._4_4_ * (float)local_640._0_4_;
            auVar160._8_4_ = auVar234._8_4_ * (float)local_640._0_4_;
            auVar160._12_4_ = auVar234._12_4_ * (float)local_640._0_4_;
            auVar234 = vdpps_avx(auVar84,auVar234,0x7f);
            fVar171 = auVar234._0_4_;
            auVar176._0_4_ = auVar84._0_4_ * fVar171;
            auVar176._4_4_ = auVar84._4_4_ * fVar171;
            auVar176._8_4_ = auVar84._8_4_ * fVar171;
            auVar176._12_4_ = auVar84._12_4_ * fVar171;
            auVar3 = vsubps_avx(auVar160,auVar176);
            fVar171 = auVar87._0_4_ * (float)local_660._0_4_;
            auVar234 = vmaxss_avx(ZEXT416((uint)fVar139),
                                  ZEXT416((uint)(local_5a0._0_4_ * fVar192 * 1.9073486e-06)));
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar130._16_16_ = local_7c0._16_16_;
            auVar90 = vxorps_avx512vl(auVar84,auVar19);
            auVar177._0_4_ = fVar210 * auVar3._0_4_ * fVar171;
            auVar177._4_4_ = fVar155 * auVar3._4_4_ * fVar171;
            auVar177._8_4_ = fVar170 * auVar3._8_4_ * fVar171;
            auVar177._12_4_ = fVar224 * auVar3._12_4_ * fVar171;
            auVar87 = vdpps_avx(auVar90,local_7e0,0x7f);
            auVar3 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar139),auVar234);
            auVar86 = vdpps_avx(auVar88,auVar177,0x7f);
            auVar3 = vfmadd213ss_fma(ZEXT416((uint)(fVar214 + 1.0)),
                                     ZEXT416((uint)(fVar139 / fVar212)),auVar3);
            fVar210 = auVar87._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_580._0_16_,local_7e0,0x7f);
            auVar87 = vdpps_avx(auVar88,auVar90,0x7f);
            auVar89 = vmulss_avx512f(auVar89,auVar85);
            fVar211 = fVar211 + auVar89._0_4_ * auVar85._0_4_ * auVar85._0_4_;
            auVar85 = vdpps_avx(auVar88,local_580._0_16_,0x7f);
            auVar90 = vfnmadd231ss_fma(auVar87,auVar91,ZEXT416((uint)fVar210));
            auVar85 = vfnmadd231ss_fma(auVar85,auVar91,auVar86);
            auVar87 = vpermilps_avx(local_480._0_16_,0xff);
            fVar213 = fVar213 - auVar87._0_4_;
            auVar89 = vshufps_avx(auVar84,auVar84,0xff);
            auVar87 = vfmsub213ss_fma(auVar90,ZEXT416((uint)fVar211),auVar89);
            auVar235._8_4_ = 0x80000000;
            auVar235._0_8_ = 0x8000000080000000;
            auVar235._12_4_ = 0x80000000;
            auVar237 = ZEXT1664(auVar235);
            auVar227._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
            auVar227._8_4_ = auVar87._8_4_ ^ 0x80000000;
            auVar227._12_4_ = auVar87._12_4_ ^ 0x80000000;
            auVar231 = ZEXT1664(auVar227);
            auVar85 = ZEXT416((uint)(auVar85._0_4_ * fVar211));
            auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                      ZEXT416((uint)fVar210),auVar85);
            auVar87 = vinsertps_avx(auVar227,auVar85,0x1c);
            auVar220._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar220._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar220._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar85 = vinsertps_avx(ZEXT416((uint)fVar210),auVar220,0x10);
            auVar197._0_4_ = auVar90._0_4_;
            auVar197._4_4_ = auVar197._0_4_;
            auVar197._8_4_ = auVar197._0_4_;
            auVar197._12_4_ = auVar197._0_4_;
            auVar86 = vdivps_avx(auVar87,auVar197);
            auVar87 = vdivps_avx(auVar85,auVar197);
            fVar210 = auVar91._0_4_;
            auVar198._0_4_ = fVar210 * auVar86._0_4_ + fVar213 * auVar87._0_4_;
            auVar198._4_4_ = fVar210 * auVar86._4_4_ + fVar213 * auVar87._4_4_;
            auVar198._8_4_ = fVar210 * auVar86._8_4_ + fVar213 * auVar87._8_4_;
            auVar198._12_4_ = fVar210 * auVar86._12_4_ + fVar213 * auVar87._12_4_;
            auVar86 = vsubps_avx(local_5a0._0_16_,auVar198);
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar87 = vandps_avx512vl(auVar91,auVar20);
            if (auVar87._0_4_ < auVar3._0_4_) {
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar234._0_4_)),local_540,
                                        ZEXT416(0x36000000));
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(ZEXT416((uint)fVar213),auVar21);
              if (auVar91._0_4_ < auVar87._0_4_) {
                bVar81 = uVar80 < 5;
                fVar192 = auVar86._0_4_ + (float)local_550._0_4_;
                bVar74 = 0;
                if ((fVar192 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar192))
                goto LAB_01a3ba3c;
                auVar86 = vmovshdup_avx(auVar86);
                fVar139 = auVar86._0_4_;
                bVar74 = 0;
                if ((fVar139 < 0.0) || (bVar74 = 0, 1.0 < fVar139)) goto LAB_01a3ba3c;
                auVar66._12_4_ = 0;
                auVar66._0_12_ = ZEXT412(0);
                auVar130._4_12_ = ZEXT412(0);
                auVar130._0_4_ = local_740._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar66 << 0x20,auVar130._0_16_);
                fVar210 = auVar86._0_4_;
                auVar86 = vmulss_avx512f(local_740._0_16_,ZEXT416(0xbf000000));
                pGVar4 = (context->scene->geometries).items[local_928].ptr;
                if ((pGVar4->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar74 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a3ba3c;
                  local_920._0_4_ = ray->tfar;
                  fVar210 = fVar210 * 1.5 + auVar86._0_4_ * fVar210 * fVar210 * fVar210;
                  auVar199._0_4_ = auVar88._0_4_ * fVar210;
                  auVar199._4_4_ = auVar88._4_4_ * fVar210;
                  auVar199._8_4_ = auVar88._8_4_ * fVar210;
                  auVar199._12_4_ = auVar88._12_4_ * fVar210;
                  auVar91 = vfmadd213ps_fma(auVar89,auVar199,auVar84);
                  auVar86 = vshufps_avx(auVar199,auVar199,0xc9);
                  auVar87 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar200._0_4_ = auVar199._0_4_ * auVar87._0_4_;
                  auVar200._4_4_ = auVar199._4_4_ * auVar87._4_4_;
                  auVar200._8_4_ = auVar199._8_4_ * auVar87._8_4_;
                  auVar200._12_4_ = auVar199._12_4_ * auVar87._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar200,auVar84,auVar86);
                  auVar86 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar87 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar145._0_4_ = auVar91._0_4_ * auVar84._0_4_;
                  auVar145._4_4_ = auVar91._4_4_ * auVar84._4_4_;
                  auVar145._8_4_ = auVar91._8_4_ * auVar84._8_4_;
                  auVar145._12_4_ = auVar91._12_4_ * auVar84._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar145,auVar86,auVar87);
                  auVar86 = vshufps_avx(auVar87,auVar87,0xe9);
                  local_6a0 = vmovlps_avx(auVar86);
                  local_698 = auVar87._0_4_;
                  local_690 = 0;
                  local_68c = (undefined4)local_930;
                  local_688 = (undefined4)local_928;
                  local_684 = context->user->instID[0];
                  local_680 = context->user->instPrimID[0];
                  ray->tfar = fVar192;
                  local_964 = -1;
                  local_710.valid = &local_964;
                  local_710.geometryUserPtr = pGVar4->userPtr;
                  local_710.context = context->user;
                  local_710.hit = (RTCHitN *)&local_6a0;
                  local_710.N = 1;
                  local_960._0_8_ = pGVar4;
                  local_710.ray = (RTCRayN *)ray;
                  local_694 = fVar139;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a3bc9b:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_960._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      (*p_Var5)(&local_710);
                      auVar260 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_7a0);
                      auVar258 = ZEXT3264(local_900);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar254 = ZEXT3264(local_8c0);
                      auVar252 = ZEXT3264(local_8a0);
                      auVar251 = ZEXT3264(local_880);
                      auVar250 = ZEXT3264(local_860);
                      auVar249 = ZEXT3264(local_840);
                      auVar248 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_780);
                      auVar253 = ZEXT3264(local_760);
                      if (*local_710.valid == 0) goto LAB_01a3bd42;
                    }
                    bVar74 = 1;
                    goto LAB_01a3ba3c;
                  }
                  auVar231 = ZEXT1664(auVar227);
                  auVar237 = ZEXT1664(auVar235);
                  auVar244 = ZEXT1664(auVar88);
                  (*pGVar4->occlusionFilterN)(&local_710);
                  auVar260 = ZEXT3264(local_7c0);
                  auVar259 = ZEXT3264(local_7a0);
                  auVar258 = ZEXT3264(local_900);
                  auVar256 = ZEXT3264(local_8e0);
                  auVar254 = ZEXT3264(local_8c0);
                  auVar252 = ZEXT3264(local_8a0);
                  auVar251 = ZEXT3264(local_880);
                  auVar250 = ZEXT3264(local_860);
                  auVar249 = ZEXT3264(local_840);
                  auVar248 = ZEXT3264(local_820);
                  auVar257 = ZEXT3264(local_780);
                  auVar253 = ZEXT3264(local_760);
                  if (*local_710.valid != 0) goto LAB_01a3bc9b;
LAB_01a3bd42:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar74 = 0;
                goto LAB_01a3ba3c;
              }
            }
            uVar80 = uVar80 + 1;
          }
          bVar81 = false;
LAB_01a3ba3c:
          bVar79 = bVar79 | bVar81 & bVar74;
          auVar71._4_4_ = fStack_3dc;
          auVar71._0_4_ = local_3e0;
          auVar71._8_4_ = fStack_3d8;
          auVar71._12_4_ = fStack_3d4;
          auVar71._16_4_ = fStack_3d0;
          auVar71._20_4_ = fStack_3cc;
          auVar71._24_4_ = fStack_3c8;
          auVar71._28_4_ = fStack_3c4;
          fVar192 = ray->tfar;
          auVar36._4_4_ = fVar192;
          auVar36._0_4_ = fVar192;
          auVar36._8_4_ = fVar192;
          auVar36._12_4_ = fVar192;
          auVar36._16_4_ = fVar192;
          auVar36._20_4_ = fVar192;
          auVar36._24_4_ = fVar192;
          auVar36._28_4_ = fVar192;
          uVar13 = vcmpps_avx512vl(auVar71,auVar36,2);
        }
        auVar168._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
        auVar168._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
        auVar168._8_4_ = fStack_418 + fStack_3f8;
        auVar168._12_4_ = fStack_414 + fStack_3f4;
        auVar168._16_4_ = fStack_410 + fStack_3f0;
        auVar168._20_4_ = fStack_40c + fStack_3ec;
        auVar168._24_4_ = fStack_408 + fStack_3e8;
        auVar168._28_4_ = fStack_404 + fStack_3e4;
        fVar139 = ray->tfar;
        fVar192 = ray->tfar;
        auVar37._4_4_ = fVar192;
        auVar37._0_4_ = fVar192;
        auVar37._8_4_ = fVar192;
        auVar37._12_4_ = fVar192;
        auVar37._16_4_ = fVar192;
        auVar37._20_4_ = fVar192;
        auVar37._24_4_ = fVar192;
        auVar37._28_4_ = fVar192;
        uVar13 = vcmpps_avx512vl(auVar168,auVar37,2);
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar169,auVar38);
        bVar81 = (bool)((byte)local_7c8 & 1);
        local_400._0_4_ = (uint)bVar81 * auVar99._0_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)((byte)(local_7c8 >> 1) & 1);
        local_400._4_4_ = (uint)bVar81 * auVar99._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)((byte)(local_7c8 >> 2) & 1);
        fStack_3f8 = (float)((uint)bVar81 * auVar99._8_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_7c8 >> 3) & 1);
        fStack_3f4 = (float)((uint)bVar81 * auVar99._12_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_7c8 >> 4) & 1);
        fStack_3f0 = (float)((uint)bVar81 * auVar99._16_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_7c8 >> 5) & 1);
        fStack_3ec = (float)((uint)bVar81 * auVar99._20_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_7c8 >> 6) & 1);
        fStack_3e8 = (float)((uint)bVar81 * auVar99._24_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)((byte)(local_7c8 >> 7) & 1);
        fStack_3e4 = (float)((uint)bVar81 * auVar99._28_4_ | (uint)!bVar81 * 2);
        bVar73 = (byte)uVar14 & bVar73 & (byte)uVar13;
        uVar13 = vpcmpd_avx512vl(_local_400,local_3a0,2);
        bVar76 = (byte)uVar13 & bVar73;
        local_440 = _local_380;
        local_3e0 = (float)local_420._0_4_ + (float)local_380._0_4_;
        fStack_3dc = (float)local_420._4_4_ + (float)local_380._4_4_;
        fStack_3d8 = fStack_418 + fStack_378;
        fStack_3d4 = fStack_414 + fStack_374;
        fStack_3d0 = fStack_410 + fStack_370;
        fStack_3cc = fStack_40c + fStack_36c;
        fStack_3c8 = fStack_408 + fStack_368;
        fStack_3c4 = fStack_404 + fStack_364;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar99);
        for (; auVar99 = local_920, bVar76 != 0; bVar76 = ~bVar77 & bVar76 & (byte)uVar13) {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar154,local_440);
          auVar131._0_4_ =
               (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 1 & 1);
          auVar131._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 2 & 1);
          auVar131._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 3 & 1);
          auVar131._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 4 & 1);
          auVar131._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 5 & 1);
          auVar131._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar76 >> 6 & 1);
          auVar131._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * 0x7f800000;
          auVar131._28_4_ =
               (uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar131,auVar131,0xb1);
          auVar96 = vminps_avx(auVar131,auVar96);
          auVar97 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar97);
          auVar97 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar97);
          uVar13 = vcmpps_avx512vl(auVar131,auVar96,0);
          bVar74 = (byte)uVar13 & bVar76;
          bVar77 = bVar76;
          if (bVar74 != 0) {
            bVar77 = bVar74;
          }
          iVar16 = 0;
          for (uVar83 = (uint)bVar77; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar16 = iVar16 + 1;
          }
          bVar77 = '\x01' << ((byte)iVar16 & 0x1f);
          auVar231 = ZEXT464(*(uint *)(local_360 + (uint)(iVar16 << 2)));
          aVar1 = (ray->dir).field_0;
          local_580._0_16_ = (undefined1  [16])aVar1;
          auVar86 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar86._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar76;
            local_920._2_30_ = auVar99._2_30_;
            local_960._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar16 << 2)));
            local_740._0_16_ = ZEXT416(*(uint *)(local_360 + (uint)(iVar16 << 2)));
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar244 = ZEXT1664(auVar244._0_16_);
            fVar192 = sqrtf(auVar86._0_4_);
            auVar231 = ZEXT1664(local_740._0_16_);
            bVar76 = local_920[0];
            auVar260 = ZEXT3264(local_7c0);
            auVar259 = ZEXT3264(local_7a0);
            auVar258 = ZEXT3264(local_900);
            auVar256 = ZEXT3264(local_8e0);
            auVar254 = ZEXT3264(local_8c0);
            auVar252 = ZEXT3264(local_8a0);
            auVar251 = ZEXT3264(local_880);
            auVar250 = ZEXT3264(local_860);
            auVar249 = ZEXT3264(local_840);
            auVar248 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_780);
            auVar253 = ZEXT3264(local_760);
            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar255 = ZEXT3264(auVar99);
            auVar86 = local_960._0_16_;
          }
          else {
            auVar86 = vsqrtss_avx(auVar86,auVar86);
            fVar192 = auVar86._0_4_;
            auVar86 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar16 << 2)));
          }
          uVar82 = (ulong)bVar77;
          auVar84 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar87 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar91 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar85 = vminps_avx(auVar84,auVar91);
          auVar84 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar91 = vmaxps_avx(auVar87,auVar84);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar85,auVar201);
          auVar84 = vandps_avx(auVar91,auVar201);
          auVar87 = vmaxps_avx(auVar87,auVar84);
          auVar84 = vmovshdup_avx(auVar87);
          auVar84 = vmaxss_avx(auVar84,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar84);
          fVar139 = auVar87._0_4_ * 1.9073486e-06;
          local_540 = vshufps_avx(auVar91,auVar91,0xff);
          auVar86 = vinsertps_avx(auVar231._0_16_,auVar86,0x10);
          uVar80 = 0;
          while( true ) {
            bVar74 = (byte)uVar82;
            if (uVar80 == 5) break;
            uVar140 = auVar86._0_4_;
            auVar146._4_4_ = uVar140;
            auVar146._0_4_ = uVar140;
            auVar146._8_4_ = uVar140;
            auVar146._12_4_ = uVar140;
            auVar84 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_580._0_16_);
            auVar87 = vmovshdup_avx(auVar86);
            fVar214 = auVar87._0_4_;
            fVar155 = 1.0 - fVar214;
            fVar210 = fVar214 * fVar214;
            auVar234 = SUB6416(ZEXT464(0x40400000),0);
            auVar89 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar85 = vfmadd213ss_fma(auVar234,auVar87,auVar89);
            auVar91 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar210),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar88 = vfmadd213ss_fma(auVar234,ZEXT416((uint)fVar155),auVar89);
            auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar155 * fVar155)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar211 = fVar155 * fVar155 * -fVar214 * 0.5;
            fVar212 = auVar91._0_4_ * 0.5;
            fVar213 = auVar88._0_4_ * 0.5;
            fVar214 = fVar214 * fVar214 * -fVar155 * 0.5;
            auVar202._0_4_ = fVar214 * (float)local_620._0_4_;
            auVar202._4_4_ = fVar214 * (float)local_620._4_4_;
            auVar202._8_4_ = fVar214 * fStack_618;
            auVar202._12_4_ = fVar214 * fStack_614;
            auVar216._4_4_ = fVar213;
            auVar216._0_4_ = fVar213;
            auVar216._8_4_ = fVar213;
            auVar216._12_4_ = fVar213;
            auVar91 = vfmadd132ps_fma(auVar216,auVar202,local_5e0._0_16_);
            auVar178._4_4_ = fVar212;
            auVar178._0_4_ = fVar212;
            auVar178._8_4_ = fVar212;
            auVar178._12_4_ = fVar212;
            auVar91 = vfmadd132ps_fma(auVar178,auVar91,local_600._0_16_);
            auVar203._4_4_ = fVar211;
            auVar203._0_4_ = fVar211;
            auVar203._8_4_ = fVar211;
            auVar203._12_4_ = fVar211;
            auVar91 = vfmadd132ps_fma(auVar203,auVar91,local_5c0._0_16_);
            auVar88 = vfmadd231ss_fma(auVar89,auVar87,ZEXT416(0x41100000));
            _local_4a0 = auVar88;
            auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar87,ZEXT416(0x40800000));
            local_4c0._0_16_ = auVar88;
            local_920._0_16_ = auVar87;
            auVar87 = vfmadd213ss_fma(auVar234,auVar87,ZEXT416(0xbf800000));
            local_4e0._0_16_ = auVar87;
            local_480._0_16_ = auVar91;
            auVar87 = vsubps_avx(auVar84,auVar91);
            local_960._0_16_ = auVar87;
            auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
            local_740._0_16_ = auVar87;
            local_5a0._0_16_ = auVar86;
            if (auVar87._0_4_ < 0.0) {
              local_6c0._0_4_ = auVar85._0_4_;
              local_6e0._0_16_ = ZEXT416((uint)fVar155);
              local_640._0_4_ = fVar210;
              local_660._0_4_ = fVar155 * -2.0;
              auVar248._0_4_ = sqrtf(auVar87._0_4_);
              auVar248._4_60_ = extraout_var_00;
              auVar85 = ZEXT416((uint)local_6c0._0_4_);
              auVar86 = auVar248._0_16_;
              uVar82 = extraout_RAX_02;
              auVar87 = local_6e0._0_16_;
            }
            else {
              auVar86 = vsqrtss_avx(auVar87,auVar87);
              local_660._0_4_ = fVar155 * -2.0;
              local_640._0_4_ = fVar210;
              auVar87 = ZEXT416((uint)fVar155);
            }
            fVar211 = auVar87._0_4_;
            fVar210 = local_920._0_4_;
            auVar88 = vfnmadd231ss_fma(ZEXT416((uint)(fVar210 * (fVar211 + fVar211))),auVar87,
                                       auVar87);
            auVar87 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar210 + fVar210)),
                                      ZEXT416((uint)(fVar210 * fVar210 * 3.0)));
            auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_920._0_16_,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                      ZEXT416((uint)(fVar211 + fVar211)),auVar84);
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)local_660._0_4_),local_920._0_16_,
                                      ZEXT416((uint)local_640._0_4_));
            fVar210 = auVar88._0_4_ * 0.5;
            fVar211 = auVar87._0_4_ * 0.5;
            fVar212 = auVar91._0_4_ * 0.5;
            fVar213 = auVar84._0_4_ * 0.5;
            auVar204._0_4_ = fVar213 * (float)local_620._0_4_;
            auVar204._4_4_ = fVar213 * (float)local_620._4_4_;
            auVar204._8_4_ = fVar213 * fStack_618;
            auVar204._12_4_ = fVar213 * fStack_614;
            auVar179._4_4_ = fVar212;
            auVar179._0_4_ = fVar212;
            auVar179._8_4_ = fVar212;
            auVar179._12_4_ = fVar212;
            auVar87 = vfmadd132ps_fma(auVar179,auVar204,local_5e0._0_16_);
            auVar161._4_4_ = fVar211;
            auVar161._0_4_ = fVar211;
            auVar161._8_4_ = fVar211;
            auVar161._12_4_ = fVar211;
            auVar87 = vfmadd132ps_fma(auVar161,auVar87,local_600._0_16_);
            auVar247._4_4_ = fVar210;
            auVar247._0_4_ = fVar210;
            auVar247._8_4_ = fVar210;
            auVar247._12_4_ = fVar210;
            local_6c0._0_16_ = vfmadd132ps_fma(auVar247,auVar87,local_5c0._0_16_);
            local_640._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
            auVar67._12_4_ = 0;
            auVar67._0_12_ = ZEXT812(0);
            fVar210 = local_640._0_4_;
            local_7e0 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar210));
            fVar211 = local_7e0._0_4_;
            local_660._0_16_ = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar210));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(local_640._0_16_,auVar22);
            auVar87 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_6e0._0_4_ = auVar86._0_4_;
            if (fVar210 < auVar84._0_4_) {
              local_7f0._0_4_ = fVar210 * -0.5;
              fVar212 = sqrtf(fVar210);
              auVar86 = ZEXT416((uint)local_6e0._0_4_);
              uVar82 = extraout_RAX_03;
              fVar210 = (float)local_7f0._0_4_;
              auVar84 = local_6c0._0_16_;
            }
            else {
              auVar84 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
              fVar212 = auVar84._0_4_;
              fVar210 = fVar210 * -0.5;
              auVar84 = local_6c0._0_16_;
            }
            fVar213 = local_7e0._0_4_;
            fVar210 = fVar211 * 1.5 + fVar210 * fVar213 * fVar213 * fVar213;
            local_7e0._0_4_ = auVar84._0_4_ * fVar210;
            local_7e0._4_4_ = auVar84._4_4_ * fVar210;
            local_7e0._8_4_ = auVar84._8_4_ * fVar210;
            local_7e0._12_4_ = auVar84._12_4_ * fVar210;
            auVar91 = vdpps_avx(local_960._0_16_,local_7e0,0x7f);
            fVar211 = auVar86._0_4_ + 1.0;
            auVar147._0_4_ = auVar91._0_4_ * auVar91._0_4_;
            auVar147._4_4_ = auVar91._4_4_ * auVar91._4_4_;
            auVar147._8_4_ = auVar91._8_4_ * auVar91._8_4_;
            auVar147._12_4_ = auVar91._12_4_ * auVar91._12_4_;
            auVar85 = vsubps_avx(local_740._0_16_,auVar147);
            fVar213 = auVar85._0_4_;
            auVar162._4_12_ = ZEXT812(0) << 0x20;
            auVar162._0_4_ = fVar213;
            auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
            auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
            if (fVar213 < 0.0) {
              local_7f0._0_4_ = fVar211;
              local_510._0_4_ = fVar212;
              local_530 = fVar210;
              fStack_52c = fVar210;
              fStack_528 = fVar210;
              fStack_524 = fVar210;
              local_520 = auVar88;
              local_500 = auVar91;
              fVar214 = sqrtf(fVar213);
              auVar89 = ZEXT416(auVar89._0_4_);
              auVar86 = ZEXT416((uint)local_6e0._0_4_);
              uVar82 = extraout_RAX_04;
              auVar88 = local_520;
              auVar85 = local_960._0_16_;
              auVar84 = local_6c0._0_16_;
              fVar211 = (float)local_7f0._0_4_;
              auVar91 = local_500;
              fVar210 = local_530;
              fVar155 = fStack_52c;
              fVar170 = fStack_528;
              fVar224 = fStack_524;
              fVar212 = (float)local_510._0_4_;
            }
            else {
              auVar85 = vsqrtss_avx(auVar85,auVar85);
              fVar214 = auVar85._0_4_;
              auVar85 = local_960._0_16_;
              fVar155 = fVar210;
              fVar170 = fVar210;
              fVar224 = fVar210;
            }
            auVar244 = ZEXT1664(auVar85);
            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar255 = ZEXT3264(auVar99);
            auVar253 = ZEXT3264(local_760);
            auVar257 = ZEXT3264(local_780);
            auVar248 = ZEXT3264(local_820);
            auVar249 = ZEXT3264(local_840);
            auVar250 = ZEXT3264(local_860);
            auVar251 = ZEXT3264(local_880);
            auVar252 = ZEXT3264(local_8a0);
            auVar254 = ZEXT3264(local_8c0);
            auVar256 = ZEXT3264(local_8e0);
            auVar258 = ZEXT3264(local_900);
            auVar259 = ZEXT3264(local_7a0);
            auVar260 = ZEXT3264(local_7c0);
            auVar163._0_4_ = (float)local_4e0._0_4_ * (float)local_620._0_4_;
            auVar163._4_4_ = (float)local_4e0._0_4_ * (float)local_620._4_4_;
            auVar163._8_4_ = (float)local_4e0._0_4_ * fStack_618;
            auVar163._12_4_ = (float)local_4e0._0_4_ * fStack_614;
            auVar180._4_4_ = local_4c0._0_4_;
            auVar180._0_4_ = local_4c0._0_4_;
            auVar180._8_4_ = local_4c0._0_4_;
            auVar180._12_4_ = local_4c0._0_4_;
            auVar234 = vfmadd132ps_fma(auVar180,auVar163,local_5e0._0_16_);
            auVar164._4_4_ = local_4a0._0_4_;
            auVar164._0_4_ = local_4a0._0_4_;
            auVar164._8_4_ = local_4a0._0_4_;
            auVar164._12_4_ = local_4a0._0_4_;
            auVar234 = vfmadd132ps_fma(auVar164,auVar234,local_600._0_16_);
            auVar3 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                     ZEXT416(0x40000000));
            uVar140 = auVar3._0_4_;
            auVar181._4_4_ = uVar140;
            auVar181._0_4_ = uVar140;
            auVar181._8_4_ = uVar140;
            auVar181._12_4_ = uVar140;
            auVar234 = vfmadd132ps_fma(auVar181,auVar234,local_5c0._0_16_);
            auVar165._0_4_ = auVar234._0_4_ * (float)local_640._0_4_;
            auVar165._4_4_ = auVar234._4_4_ * (float)local_640._0_4_;
            auVar165._8_4_ = auVar234._8_4_ * (float)local_640._0_4_;
            auVar165._12_4_ = auVar234._12_4_ * (float)local_640._0_4_;
            auVar234 = vdpps_avx(auVar84,auVar234,0x7f);
            fVar171 = auVar234._0_4_;
            auVar182._0_4_ = auVar84._0_4_ * fVar171;
            auVar182._4_4_ = auVar84._4_4_ * fVar171;
            auVar182._8_4_ = auVar84._8_4_ * fVar171;
            auVar182._12_4_ = auVar84._12_4_ * fVar171;
            auVar3 = vsubps_avx(auVar165,auVar182);
            fVar171 = auVar87._0_4_ * (float)local_660._0_4_;
            auVar234 = vmaxss_avx(ZEXT416((uint)fVar139),
                                  ZEXT416((uint)(local_5a0._0_4_ * fVar192 * 1.9073486e-06)));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar90 = vxorps_avx512vl(auVar84,auVar23);
            auVar183._0_4_ = fVar210 * auVar3._0_4_ * fVar171;
            auVar183._4_4_ = fVar155 * auVar3._4_4_ * fVar171;
            auVar183._8_4_ = fVar170 * auVar3._8_4_ * fVar171;
            auVar183._12_4_ = fVar224 * auVar3._12_4_ * fVar171;
            auVar87 = vdpps_avx(auVar90,local_7e0,0x7f);
            auVar3 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar139),auVar234);
            auVar86 = vdpps_avx(auVar85,auVar183,0x7f);
            auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar211),ZEXT416((uint)(fVar139 / fVar212)),
                                     auVar3);
            fVar210 = auVar87._0_4_ + auVar86._0_4_;
            auVar86 = vdpps_avx(local_580._0_16_,local_7e0,0x7f);
            auVar87 = vdpps_avx(auVar85,auVar90,0x7f);
            fVar211 = auVar88._0_4_;
            auVar92 = vaddss_avx512f(auVar89,ZEXT416((uint)(fVar211 * fVar213 * -0.5 *
                                                           fVar211 * fVar211)));
            auVar88 = vdpps_avx(auVar85,local_580._0_16_,0x7f);
            auVar90 = vfnmadd231ss_fma(auVar87,auVar91,ZEXT416((uint)fVar210));
            auVar88 = vfnmadd231ss_fma(auVar88,auVar91,auVar86);
            auVar87 = vpermilps_avx(local_480._0_16_,0xff);
            fVar214 = fVar214 - auVar87._0_4_;
            auVar89 = vshufps_avx(auVar84,auVar84,0xff);
            auVar87 = vfmsub213ss_fma(auVar90,auVar92,auVar89);
            auVar236._8_4_ = 0x80000000;
            auVar236._0_8_ = 0x8000000080000000;
            auVar236._12_4_ = 0x80000000;
            auVar237 = ZEXT1664(auVar236);
            auVar228._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
            auVar228._8_4_ = auVar87._8_4_ ^ 0x80000000;
            auVar228._12_4_ = auVar87._12_4_ ^ 0x80000000;
            auVar231 = ZEXT1664(auVar228);
            auVar88 = ZEXT416((uint)(auVar88._0_4_ * auVar92._0_4_));
            auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_)),
                                      ZEXT416((uint)fVar210),auVar88);
            auVar87 = vinsertps_avx(auVar228,auVar88,0x1c);
            auVar221._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
            auVar221._8_4_ = auVar86._8_4_ ^ 0x80000000;
            auVar221._12_4_ = auVar86._12_4_ ^ 0x80000000;
            auVar88 = vinsertps_avx(ZEXT416((uint)fVar210),auVar221,0x10);
            auVar205._0_4_ = auVar90._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar86 = vdivps_avx(auVar87,auVar205);
            auVar87 = vdivps_avx(auVar88,auVar205);
            fVar210 = auVar91._0_4_;
            auVar206._0_4_ = fVar210 * auVar86._0_4_ + fVar214 * auVar87._0_4_;
            auVar206._4_4_ = fVar210 * auVar86._4_4_ + fVar214 * auVar87._4_4_;
            auVar206._8_4_ = fVar210 * auVar86._8_4_ + fVar214 * auVar87._8_4_;
            auVar206._12_4_ = fVar210 * auVar86._12_4_ + fVar214 * auVar87._12_4_;
            auVar86 = vsubps_avx(local_5a0._0_16_,auVar206);
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar87 = vandps_avx512vl(auVar91,auVar24);
            if (auVar87._0_4_ < auVar3._0_4_) {
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ + auVar234._0_4_)),local_540,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(ZEXT416((uint)fVar214),auVar25);
              if (auVar91._0_4_ < auVar87._0_4_) {
                bVar81 = uVar80 < 5;
                fVar192 = auVar86._0_4_ + (float)local_550._0_4_;
                bVar74 = 0;
                if ((fVar192 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar192))
                goto LAB_01a3c641;
                auVar86 = vmovshdup_avx(auVar86);
                fVar139 = auVar86._0_4_;
                bVar74 = 0;
                if ((fVar139 < 0.0) || (bVar74 = 0, 1.0 < fVar139)) goto LAB_01a3c641;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_740._0_4_));
                fVar210 = auVar86._0_4_;
                pGVar4 = (context->scene->geometries).items[local_928].ptr;
                if ((pGVar4->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar74 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a3c641;
                  local_920._0_4_ = ray->tfar;
                  fVar210 = fVar210 * 1.5 + local_740._0_4_ * -0.5 * fVar210 * fVar210 * fVar210;
                  auVar207._0_4_ = auVar85._0_4_ * fVar210;
                  auVar207._4_4_ = auVar85._4_4_ * fVar210;
                  auVar207._8_4_ = auVar85._8_4_ * fVar210;
                  auVar207._12_4_ = auVar85._12_4_ * fVar210;
                  auVar91 = vfmadd213ps_fma(auVar89,auVar207,auVar84);
                  auVar86 = vshufps_avx(auVar207,auVar207,0xc9);
                  auVar87 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar208._0_4_ = auVar207._0_4_ * auVar87._0_4_;
                  auVar208._4_4_ = auVar207._4_4_ * auVar87._4_4_;
                  auVar208._8_4_ = auVar207._8_4_ * auVar87._8_4_;
                  auVar208._12_4_ = auVar207._12_4_ * auVar87._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar208,auVar84,auVar86);
                  auVar86 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar87 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar148._0_4_ = auVar91._0_4_ * auVar84._0_4_;
                  auVar148._4_4_ = auVar91._4_4_ * auVar84._4_4_;
                  auVar148._8_4_ = auVar91._8_4_ * auVar84._8_4_;
                  auVar148._12_4_ = auVar91._12_4_ * auVar84._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar148,auVar86,auVar87);
                  auVar86 = vshufps_avx(auVar87,auVar87,0xe9);
                  local_6a0 = vmovlps_avx(auVar86);
                  local_698 = auVar87._0_4_;
                  local_690 = 0;
                  local_68c = (undefined4)local_930;
                  local_688 = (undefined4)local_928;
                  local_684 = context->user->instID[0];
                  local_680 = context->user->instPrimID[0];
                  ray->tfar = fVar192;
                  local_964 = -1;
                  local_710.valid = &local_964;
                  local_710.geometryUserPtr = pGVar4->userPtr;
                  local_710.context = context->user;
                  local_710.hit = (RTCHitN *)&local_6a0;
                  local_710.N = 1;
                  local_960._0_8_ = pGVar4;
                  local_710.ray = (RTCRayN *)ray;
                  local_694 = fVar139;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a3c8a7:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_960._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      (*p_Var5)(&local_710);
                      auVar260 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_7a0);
                      auVar258 = ZEXT3264(local_900);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar254 = ZEXT3264(local_8c0);
                      auVar252 = ZEXT3264(local_8a0);
                      auVar251 = ZEXT3264(local_880);
                      auVar250 = ZEXT3264(local_860);
                      auVar249 = ZEXT3264(local_840);
                      auVar248 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_780);
                      auVar253 = ZEXT3264(local_760);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar255 = ZEXT3264(auVar99);
                      if (*local_710.valid == 0) goto LAB_01a3c95c;
                    }
                    bVar74 = 1;
                    goto LAB_01a3c641;
                  }
                  auVar231 = ZEXT1664(auVar228);
                  auVar237 = ZEXT1664(auVar236);
                  auVar244 = ZEXT1664(auVar85);
                  (*pGVar4->occlusionFilterN)(&local_710);
                  auVar260 = ZEXT3264(local_7c0);
                  auVar259 = ZEXT3264(local_7a0);
                  auVar258 = ZEXT3264(local_900);
                  auVar256 = ZEXT3264(local_8e0);
                  auVar254 = ZEXT3264(local_8c0);
                  auVar252 = ZEXT3264(local_8a0);
                  auVar251 = ZEXT3264(local_880);
                  auVar250 = ZEXT3264(local_860);
                  auVar249 = ZEXT3264(local_840);
                  auVar248 = ZEXT3264(local_820);
                  auVar257 = ZEXT3264(local_780);
                  auVar253 = ZEXT3264(local_760);
                  auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar255 = ZEXT3264(auVar99);
                  if (*local_710.valid != 0) goto LAB_01a3c8a7;
LAB_01a3c95c:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar74 = 0;
                goto LAB_01a3c641;
              }
            }
            uVar80 = uVar80 + 1;
          }
          bVar81 = false;
LAB_01a3c641:
          bVar79 = bVar79 | bVar81 & bVar74;
          fVar139 = ray->tfar;
          auVar72._4_4_ = fStack_3dc;
          auVar72._0_4_ = local_3e0;
          auVar72._8_4_ = fStack_3d8;
          auVar72._12_4_ = fStack_3d4;
          auVar72._16_4_ = fStack_3d0;
          auVar72._20_4_ = fStack_3cc;
          auVar72._24_4_ = fStack_3c8;
          auVar72._28_4_ = fStack_3c4;
          fVar192 = ray->tfar;
          auVar39._4_4_ = fVar192;
          auVar39._0_4_ = fVar192;
          auVar39._8_4_ = fVar192;
          auVar39._12_4_ = fVar192;
          auVar39._16_4_ = fVar192;
          auVar39._20_4_ = fVar192;
          auVar39._24_4_ = fVar192;
          auVar39._28_4_ = fVar192;
          uVar13 = vcmpps_avx512vl(auVar72,auVar39,2);
        }
        uVar15 = vpcmpd_avx512vl(local_3a0,local_300,1);
        uVar14 = vpcmpd_avx512vl(local_3a0,_local_400,1);
        auVar190._0_4_ = (float)local_420._0_4_ + (float)local_340._0_4_;
        auVar190._4_4_ = (float)local_420._4_4_ + (float)local_340._4_4_;
        auVar190._8_4_ = fStack_418 + fStack_338;
        auVar190._12_4_ = fStack_414 + fStack_334;
        auVar190._16_4_ = fStack_410 + fStack_330;
        auVar190._20_4_ = fStack_40c + fStack_32c;
        auVar190._24_4_ = fStack_408 + fStack_328;
        auVar190._28_4_ = fStack_404 + fStack_324;
        auVar209._4_4_ = fVar139;
        auVar209._0_4_ = fVar139;
        auVar209._8_4_ = fVar139;
        auVar209._12_4_ = fVar139;
        auVar209._16_4_ = fVar139;
        auVar209._20_4_ = fVar139;
        auVar209._24_4_ = fVar139;
        auVar209._28_4_ = fVar139;
        uVar13 = vcmpps_avx512vl(auVar190,auVar209,2);
        bVar76 = (byte)local_7c4 & (byte)uVar15 & (byte)uVar13;
        auVar191._0_4_ = (float)local_420._0_4_ + (float)local_380._0_4_;
        auVar191._4_4_ = (float)local_420._4_4_ + (float)local_380._4_4_;
        auVar191._8_4_ = fStack_418 + fStack_378;
        auVar191._12_4_ = fStack_414 + fStack_374;
        auVar191._16_4_ = fStack_410 + fStack_370;
        auVar191._20_4_ = fStack_40c + fStack_36c;
        auVar191._24_4_ = fStack_408 + fStack_368;
        auVar191._28_4_ = fStack_404 + fStack_364;
        uVar13 = vcmpps_avx512vl(auVar191,auVar209,2);
        bVar73 = bVar73 & (byte)uVar14 & (byte)uVar13 | bVar76;
        prim = local_670;
        if (bVar73 != 0) {
          uVar80 = (ulong)uVar75;
          abStack_180[uVar80 * 0x60] = bVar73;
          bVar81 = (bool)(bVar76 >> 1 & 1);
          bVar6 = (bool)(bVar76 >> 2 & 1);
          bVar7 = (bool)(bVar76 >> 3 & 1);
          bVar8 = (bool)(bVar76 >> 4 & 1);
          bVar9 = (bool)(bVar76 >> 5 & 1);
          bVar10 = (bool)(bVar76 >> 6 & 1);
          auStack_160[uVar80 * 0x18] =
               (uint)(bVar76 & 1) * local_340._0_4_ | (uint)!(bool)(bVar76 & 1) * local_380._0_4_;
          auStack_160[uVar80 * 0x18 + 1] =
               (uint)bVar81 * local_340._4_4_ | (uint)!bVar81 * local_380._4_4_;
          auStack_160[uVar80 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_338 | (uint)!bVar6 * (int)fStack_378;
          auStack_160[uVar80 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_334 | (uint)!bVar7 * (int)fStack_374;
          auStack_160[uVar80 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_330 | (uint)!bVar8 * (int)fStack_370;
          auStack_160[uVar80 * 0x18 + 5] =
               (uint)bVar9 * (int)fStack_32c | (uint)!bVar9 * (int)fStack_36c;
          auStack_160[uVar80 * 0x18 + 6] =
               (uint)bVar10 * (int)fStack_328 | (uint)!bVar10 * (int)fStack_368;
          auStack_160[uVar80 * 0x18 + 7] =
               (uint)(bVar76 >> 7) * (int)fStack_324 | (uint)!(bool)(bVar76 >> 7) * (int)fStack_364;
          uVar82 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar80 * 0xc] = uVar82;
          aiStack_138[uVar80 * 0x18] = local_974 + 1;
          uVar75 = uVar75 + 1;
        }
      }
    }
    fVar192 = ray->tfar;
    auVar150._4_4_ = fVar192;
    auVar150._0_4_ = fVar192;
    auVar150._8_4_ = fVar192;
    auVar150._12_4_ = fVar192;
    auVar150._16_4_ = fVar192;
    auVar150._20_4_ = fVar192;
    auVar150._24_4_ = fVar192;
    auVar150._28_4_ = fVar192;
    do {
      uVar83 = uVar75;
      uVar132 = uVar83 - 1;
      if (uVar83 == 0) {
        if (bVar79 != 0) goto LAB_01a3cac4;
        uVar13 = vcmpps_avx512vl(auVar150,local_2e0,0xd);
        local_668 = (ulong)((uint)local_4e8 & (uint)uVar13);
        goto LAB_01a3a1ed;
      }
      uVar82 = (ulong)uVar132;
      auVar99 = *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x18);
      auVar188._0_4_ = auVar99._0_4_ + (float)local_420._0_4_;
      auVar188._4_4_ = auVar99._4_4_ + (float)local_420._4_4_;
      auVar188._8_4_ = auVar99._8_4_ + fStack_418;
      auVar188._12_4_ = auVar99._12_4_ + fStack_414;
      auVar188._16_4_ = auVar99._16_4_ + fStack_410;
      auVar188._20_4_ = auVar99._20_4_ + fStack_40c;
      auVar188._24_4_ = auVar99._24_4_ + fStack_408;
      auVar188._28_4_ = auVar99._28_4_ + fStack_404;
      uVar13 = vcmpps_avx512vl(auVar188,auVar150,2);
      uVar133 = (uint)uVar13 & (uint)abStack_180[uVar82 * 0x60];
      uVar75 = uVar132;
    } while (uVar133 == 0);
    uVar80 = (&uStack_140)[uVar82 * 0xc];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar80;
    auVar189._8_4_ = 0x7f800000;
    auVar189._0_8_ = 0x7f8000007f800000;
    auVar189._12_4_ = 0x7f800000;
    auVar189._16_4_ = 0x7f800000;
    auVar189._20_4_ = 0x7f800000;
    auVar189._24_4_ = 0x7f800000;
    auVar189._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar189,auVar99);
    bVar73 = (byte)uVar133;
    auVar128._0_4_ =
         (uint)(bVar73 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)auVar99._0_4_;
    bVar81 = (bool)((byte)(uVar133 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * (int)auVar99._4_4_;
    bVar81 = (bool)((byte)(uVar133 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * (int)auVar99._8_4_;
    bVar81 = (bool)((byte)(uVar133 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * (int)auVar99._12_4_;
    bVar81 = (bool)((byte)(uVar133 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * (int)auVar99._16_4_;
    bVar81 = (bool)((byte)(uVar133 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * (int)auVar99._20_4_;
    bVar81 = (bool)((byte)(uVar133 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * (int)auVar99._24_4_;
    auVar128._28_4_ =
         (uVar133 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar133 >> 7,0) * (int)auVar99._28_4_;
    auVar99 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar99 = vminps_avx(auVar128,auVar99);
    auVar96 = vshufpd_avx(auVar99,auVar99,5);
    auVar99 = vminps_avx(auVar99,auVar96);
    auVar96 = vpermpd_avx2(auVar99,0x4e);
    auVar99 = vminps_avx(auVar99,auVar96);
    uVar13 = vcmpps_avx512vl(auVar128,auVar99,0);
    bVar76 = (byte)uVar13 & bVar73;
    if (bVar76 != 0) {
      uVar133 = (uint)bVar76;
    }
    uVar134 = 0;
    for (; (uVar133 & 1) == 0; uVar133 = uVar133 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_974 = aiStack_138[uVar82 * 0x18];
    bVar73 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar73;
    abStack_180[uVar82 * 0x60] = bVar73;
    uVar75 = uVar83;
    if (bVar73 == 0) {
      uVar75 = uVar132;
    }
    uVar140 = (undefined4)uVar80;
    auVar167._4_4_ = uVar140;
    auVar167._0_4_ = uVar140;
    auVar167._8_4_ = uVar140;
    auVar167._12_4_ = uVar140;
    auVar167._16_4_ = uVar140;
    auVar167._20_4_ = uVar140;
    auVar167._24_4_ = uVar140;
    auVar167._28_4_ = uVar140;
    auVar86 = vmovshdup_avx(auVar142);
    auVar86 = vsubps_avx(auVar86,auVar142);
    auVar151._0_4_ = auVar86._0_4_;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar151._16_4_ = auVar151._0_4_;
    auVar151._20_4_ = auVar151._0_4_;
    auVar151._24_4_ = auVar151._0_4_;
    auVar151._28_4_ = auVar151._0_4_;
    auVar86 = vfmadd132ps_fma(auVar151,auVar167,_DAT_01f7b040);
    _local_340 = ZEXT1632(auVar86);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_340 + (ulong)uVar134 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }